

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O3

int __thiscall UnixMakefileGenerator::init(UnixMakefileGenerator *this,EVP_PKEY_CTX *ctx)

{
  ProString *pPVar1;
  QMakeProject *this_00;
  QString file;
  QString string;
  totally_ordered_wrapper<QMakeFeatureRoots_*> tVar2;
  undefined1 auVar3 [8];
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  QMakeProject *pQVar9;
  QArrayDataPointer<ProString> *pQVar10;
  QArrayDataPointer<ProString> *pQVar11;
  QList<ProString> *pQVar12;
  pointer pQVar13;
  iterator iVar14;
  iterator iVar15;
  char16_t *pcVar16;
  qsizetype qVar17;
  ProStringList *pPVar18;
  ProStringList *pPVar19;
  QMovableArrayOps<ProString> *this_01;
  QString *pQVar20;
  QMakeProject *pQVar21;
  undefined8 uVar22;
  ProString *iif;
  undefined1 auVar23 [8];
  long lVar24;
  ProFile *pPVar25;
  QMakeProject **ppQVar26;
  char *pcVar27;
  EVP_PKEY_CTX *ctx_00;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  QVar28;
  QMakeProject **ppQVar29;
  undefined1 auVar30 [8];
  ulong uVar31;
  long in_FS_OFFSET;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QAnyStringView QVar45;
  QLatin1String QVar46;
  QLatin1String QVar47;
  QByteArrayView QVar48;
  QLatin1String QVar49;
  QLatin1String QVar50;
  QByteArrayView QVar51;
  QLatin1String QVar52;
  QLatin1String QVar53;
  QByteArrayView QVar54;
  QLatin1String QVar55;
  QLatin1String QVar56;
  QAnyStringView QVar57;
  QAnyStringView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QByteArrayView QVar65;
  QByteArrayView QVar66;
  QStringView config;
  QStringView config_00;
  QStringView config_01;
  QStringView config_02;
  QStringView config_03;
  QStringView config_04;
  QStringView config_05;
  QStringView config_06;
  QStringView config_07;
  QStringView config_08;
  QStringView config_09;
  QStringView config_10;
  QStringView config_11;
  QStringView config_12;
  QStringView config_13;
  QLatin1String other;
  QStringView config_14;
  QStringView config_15;
  QStringView config_16;
  QStringView config_17;
  QStringView config_18;
  QStringView config_19;
  ProStringList ret;
  ProKey runCompImp;
  ProKey runComp;
  ProStringList ret_1;
  ProString target;
  UnixMakefileGenerator *pUVar67;
  UnixMakefileGenerator *pUVar68;
  ProKey local_308;
  undefined1 local_2d8 [8];
  QMakeProject *pQStack_2d0;
  totally_ordered_wrapper<QMakeFeatureRoots_*> local_2c8;
  QArrayData *local_2a0 [3];
  QString local_288;
  undefined1 local_268 [8];
  QMakeProject *pQStack_260;
  QMakeProject *pQStack_258;
  EVP_PKEY_CTX local_248 [24];
  QMakeProject *local_230;
  QMakeProject *local_228;
  totally_ordered_wrapper<QMakeFeatureRoots_*> tStack_220;
  QArrayDataPointer<ProString> local_218;
  QArrayDataPointer<ProString> local_1f8;
  QString local_1d8;
  QArrayDataPointer<QString> local_1b8;
  ProKey local_198;
  QString local_168;
  undefined1 local_148 [8];
  QMakeProject *pQStack_140;
  QExplicitlySharedDataPointer<QMakeFeatureRoots> local_138;
  undefined1 local_118 [8];
  ProString *pPStack_110;
  ProFile *local_108;
  QHash<ProKey,_ProFunctionDef> QStack_100;
  ProValueMap local_f8;
  Location *pLStack_f0;
  undefined1 local_e8 [8];
  QMakeProject *pQStack_e0;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  local_d8;
  undefined8 uStack_d0;
  ProValueMap local_c8;
  QMakeProject *pQStack_c0;
  undefined1 local_b8 [8];
  QMakeProject *pQStack_b0;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
  local_a8;
  QMakeProject *pQStack_a0;
  ProValueMap PStack_98;
  QHash<ProKey,_ProFunctionDef> local_90;
  QHash<ProKey,_ProFunctionDef> local_88;
  undefined1 local_78 [8];
  undefined1 auStack_70 [32];
  QMakeProject *pQStack_50;
  QMakeProject *local_48;
  QMakeParser *local_40;
  QMakeHandler *local_38;
  
  local_38 = *(QMakeHandler **)(in_FS_OFFSET + 0x28);
  ppQVar29 = &(this->super_MakefileGenerator).project;
  pQVar9 = (this->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_78,"CONFIG");
  pQVar9 = (QMakeProject *)
           QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"ICON");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)local_78);
  if (bVar4) {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_b8,"RC_FILE");
    bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)local_b8);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i =
           ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    bVar4 = !bVar4;
  }
  else {
    bVar4 = false;
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (bVar4) {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_78,"RC_FILE");
    pQVar10 = (QArrayDataPointer<ProString> *)
              QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_78);
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_b8,"ICON");
    pQVar11 = (QArrayDataPointer<ProString> *)
              QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8);
    QArrayDataPointer<ProString>::operator=(pQVar11,pQVar10);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i =
           ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_EXTENSION_PLUGIN");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (bVar4) {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_EXTENSION_PLUGIN");
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_78)->
               super_QList<ProString>;
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_e8,"QMAKE_EXTENSION_SHLIB");
    QMakeEvaluator::first((ProString *)local_b8,&pQVar21->super_QMakeEvaluator,(ProKey *)local_e8);
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_b8);
    QList<ProString>::end(pQVar12);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i =
           ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_e8 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"TARGET");
  pQVar10 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_78);
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_ORIG_TARGET");
  pQVar11 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8);
  QArrayDataPointer<ProString>::operator=(pQVar11,pQVar10);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i =
         ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i + -1;
    UNLOCK();
    if (((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"VERSION");
  bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (bVar4) {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_b8,"VERSION");
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8)->
               super_QList<ProString>;
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_148,"VER_PAT");
    bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)local_148);
    if (bVar4) {
      QVar32.m_data = (storage_type *)0x1;
      QVar32.m_size = (qsizetype)local_78;
      QString::fromUtf8(QVar32);
      local_168.d.d = (Data *)local_78;
      local_168.d.ptr = (char16_t *)auStack_70._0_8_;
      local_168.d.size = auStack_70._8_8_;
      ProString::ProString((ProString *)local_118,&local_168);
    }
    else {
      pQVar21 = *ppQVar29;
      ProKey::ProKey(&local_198,"VER_PAT");
      QMakeEvaluator::first((ProString *)local_118,&pQVar21->super_QMakeEvaluator,&local_198);
    }
    local_78 = (undefined1  [8])anon_var_dwarf_2bec69;
    ProString::ProString((ProString *)auStack_70,(ProString *)local_118);
    ProString::ProString<char_const(&)[5],ProString>
              ((ProString *)local_e8,(QStringBuilder<const_char_(&)[5],_ProString> *)local_78);
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_e8);
    QList<ProString>::end(pQVar12);
    if (local_e8 != (undefined1  [8])0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
      }
    }
    if ((QMakeProject *)auStack_70._0_8_ != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_70._0_8_)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_70._0_8_)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_70._0_8_)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)auStack_70._0_8_,2,0x10);
      }
    }
    if (local_118 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_118,2,0x10);
      }
    }
    if (bVar4) {
      if ((QMakeProject *)local_168.d.d != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)
                 ->d = *(int *)&((DataPointer *)
                                &((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)->
                                d + -1;
        iVar8 = *(int *)&((DataPointer *)
                         &((QMakeEvaluator *)&(local_168.d.d)->super_QArrayData)->m_caller)->d;
        UNLOCK();
        local_198.super_ProString.m_string.d.d = local_168.d.d;
joined_r0x001a4970:
        if (iVar8 == 0) {
          QArrayData::deallocate(&(local_198.super_ProString.m_string.d.d)->super_QArrayData,2,0x10)
          ;
        }
      }
    }
    else if ((QMakeProject *)local_198.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)
               &((QMakeEvaluator *)&(local_198.super_ProString.m_string.d.d)->super_QArrayData)->
                m_caller)->d =
           *(int *)&((DataPointer *)
                    &((QMakeEvaluator *)&(local_198.super_ProString.m_string.d.d)->super_QArrayData)
                     ->m_caller)->d + -1;
      iVar8 = *(int *)&((DataPointer *)
                       &((QMakeEvaluator *)
                        &(local_198.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d;
      UNLOCK();
      goto joined_r0x001a4970;
    }
    if (local_148 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_148,2,0x10);
      }
    }
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i =
           ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
  }
  local_1b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_1b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_1b8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_b8,"VERSION");
  QMakeEvaluator::first((ProString *)local_78,&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8);
  ProString::toQString((QString *)local_e8,(ProString *)local_78);
  QString::split(&local_1b8,(QString *)local_e8,0x2e,0,1);
  if (local_e8 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i =
         ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i + -1;
    UNLOCK();
    if (((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  QVar33.m_data = (storage_type *)0x1;
  QVar33.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar33);
  local_b8 = local_78;
  pQStack_b0 = (QMakeProject *)auStack_70._0_8_;
  local_a8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )auStack_70._8_8_;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_1b8,local_1b8.size,(QString *)local_b8);
  QList<QString>::end((QList<QString> *)&local_1b8);
  QVar34.m_data = (storage_type *)0x1;
  QVar34.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar34);
  local_e8 = local_78;
  pQStack_e0 = (QMakeProject *)auStack_70._0_8_;
  local_d8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )auStack_70._8_8_;
  QtPrivate::QMovableArrayOps<QString>::emplace<QString>
            ((QMovableArrayOps<QString> *)&local_1b8,local_1b8.size,(QString *)local_e8);
  QList<QString>::end((QList<QString> *)&local_1b8);
  if (local_e8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
    }
  }
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"VER_MAJ");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_78)->
             super_QList<ProString>;
  pQVar13 = QList<QString>::data((QList<QString> *)&local_1b8);
  ProString::ProString((ProString *)local_b8,pQVar13);
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
            ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_b8);
  QList<ProString>::end(pQVar12);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"VER_MIN");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_78)->
             super_QList<ProString>;
  pQVar13 = QList<QString>::data((QList<QString> *)&local_1b8);
  ProString::ProString((ProString *)local_b8,pQVar13 + 1);
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
            ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_b8);
  QList<ProString>::end(pQVar12);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"VER_PAT");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_78)->
             super_QList<ProString>;
  pQVar13 = QList<QString>::data((QList<QString> *)&local_1b8);
  ProString::ProString((ProString *)local_b8,pQVar13 + 2);
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
            ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_b8);
  QList<ProString>::end(pQVar12);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar21 = *ppQVar29;
  pQVar20 = &(pQVar21->super_QMakeEvaluator).m_sourceRoot;
  if ((pQVar21->super_QMakeEvaluator).m_sourceRoot.d.size == 0) {
    pQVar20 = &(pQVar21->super_QMakeEvaluator).m_buildRoot;
  }
  local_1d8.d.d = (pQVar20->d).d;
  local_1d8.d.ptr = (pQVar20->d).ptr;
  local_1d8.d.size = (pQVar20->d).size;
  if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_1d8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_1d8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pQVar21 = *ppQVar29;
  }
  ProKey::ProKey((ProKey *)local_78,"QMAKE_INTERNAL_INCLUDED_FILES");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_78)->
             super_QList<ProString>;
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  iVar14 = QList<ProString>::begin(pQVar12);
  iVar15 = QList<ProString>::end(pQVar12);
  if (iVar14.i != iVar15.i) {
    do {
      pQVar21 = *ppQVar29;
      local_78 = (undefined1  [8])(pQVar21->super_QMakeEvaluator).m_cachefile.d.d;
      auStack_70._0_8_ = (pQVar21->super_QMakeEvaluator).m_cachefile.d.ptr;
      auStack_70._8_8_ = (pQVar21->super_QMakeEvaluator).m_cachefile.d.size;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&(((QMakeProject *)local_78)->super_QMakeEvaluator).m_caller)->d =
             *(int *)&((DataPointer *)&(((QMakeProject *)local_78)->super_QMakeEvaluator).m_caller)
                      ->d + 1;
        UNLOCK();
      }
      bVar4 = ProString::operator==(iVar14.i,(QString *)local_78);
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if ((!bVar4) && (bVar4 = ProString::startsWith(iVar14.i,&local_1d8,CaseSensitive), bVar4)) {
        pcVar16 = ((iVar14.i)->m_string).d.ptr;
        if (pcVar16 == (char16_t *)0x0) {
          pcVar16 = (char16_t *)&QString::_empty;
        }
        if (pcVar16[(long)(iVar14.i)->m_offset + (long)(int)local_1d8.d.size] == L'/') {
          ProString::toQString((QString *)local_118,iVar14.i);
          pUVar67 = this;
          MakefileGenerator::fileFixify
                    ((QString *)local_e8,&this->super_MakefileGenerator,(QString *)local_118,
                     (FileFixifyTypes)0x8,true);
          ProString::ProString((ProString *)local_78,(QString *)local_e8);
          pQVar21 = (this->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_b8,"DISTFILES");
          pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8)->
                     super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_78)
          ;
          QList<ProString>::end(pQVar12);
          this = pUVar67;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              this = pUVar67;
            }
          }
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
            }
          }
          if (local_118 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_118,2,0x10);
            }
          }
        }
      }
      iVar14.i = iVar14.i + 1;
    } while (iVar14.i != iVar15.i);
  }
  pQVar21 = *ppQVar29;
  ppQVar26 = ppQVar29;
  ProKey::ProKey((ProKey *)local_b8,"TEMPLATE");
  QMakeEvaluator::first((ProString *)local_78,&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8);
  bVar4 = ProString::operator==((ProString *)local_78,"app");
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (bVar4) {
    pQVar21 = *ppQVar29;
    pcVar27 = "QMAKE_APP_FLAG";
LAB_001a51ed:
    ProKey::ProKey((ProKey *)local_78,pcVar27);
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_78)->
               super_QList<ProString>;
    ProString::ProString((ProString *)local_b8,"1");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
              ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_b8);
    QList<ProString>::end(pQVar12);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  else {
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_b8,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_78,&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8);
    bVar4 = ProString::operator==((ProString *)local_78,"lib");
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (bVar4) {
      pQVar21 = *ppQVar29;
      pcVar27 = "QMAKE_LIB_FLAG";
      goto LAB_001a51ed;
    }
    pQVar21 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_b8,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_78,&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8);
    ctx_00 = (EVP_PKEY_CTX *)0x2b426a;
    bVar4 = ProString::operator==((ProString *)local_78,"subdirs");
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        ctx_00 = (EVP_PKEY_CTX *)0x2;
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
        ctx_00 = (EVP_PKEY_CTX *)0x2;
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (bVar4) {
      MakefileGenerator::init(&this->super_MakefileGenerator,ctx_00);
      pQVar9 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_78,"MAKEFILE");
      bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if (bVar4) {
        pQVar9 = *ppQVar29;
        ProKey::ProKey((ProKey *)local_78,"MAKEFILE");
        pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)->
                   super_QList<ProString>;
        ProString::ProString((ProString *)local_b8,"Makefile");
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_b8);
        QList<ProString>::end(pQVar12);
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
      }
      goto LAB_001aa042;
    }
  }
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"DESTDIR");
  pQVar10 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_78);
  pQVar21 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_ORIG_DESTDIR");
  pQVar11 = (QArrayDataPointer<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8);
  QArrayDataPointer<ProString>::operator=(pQVar11,pQVar10);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  auVar23 = (undefined1  [8])*ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_LIB_FLAG");
  bVar4 = QMakeProject::isEmpty((QMakeProject *)auVar23,(ProKey *)local_78);
  if (bVar4) {
LAB_001a5555:
    pQVar21 = *ppQVar26;
    QVar36.m_data = (storage_type *)0x2;
    QVar36.m_size = (qsizetype)local_b8;
    QString::fromUtf8(QVar36);
    auVar30 = local_b8;
    bVar6 = false;
    config_00.m_data = (storage_type_conflict *)pQStack_b0;
    config_00.m_size = (qsizetype)local_a8.d.ptr;
    bVar5 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config_00,false);
    if (bVar5) {
      pQVar21 = *ppQVar26;
      QVar37.m_data = (storage_type *)0x6;
      QVar37.m_size = (qsizetype)local_b8;
      QString::fromUtf8(QVar37);
      auVar3 = local_b8;
      config_01.m_data = (storage_type_conflict *)pQStack_b0;
      config_01.m_size = (qsizetype)local_a8.d.ptr;
      bVar6 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config_01,false);
      if (auVar3 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar3)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar3)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar3)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)auVar3,2,0x10);
        }
      }
    }
    if (auVar30 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)auVar30,2,0x10);
      }
    }
    if (!bVar4) goto LAB_001a5610;
  }
  else {
    pQVar21 = *ppQVar26;
    QVar35.m_data = (storage_type *)0x9;
    QVar35.m_size = (qsizetype)local_b8;
    QString::fromUtf8(QVar35);
    auVar23 = local_b8;
    config.m_data = (storage_type_conflict *)pQStack_b0;
    config.m_size = (qsizetype)local_a8.d.ptr;
    bVar5 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config,false);
    bVar6 = true;
    if (bVar5) goto LAB_001a5555;
LAB_001a5610:
    if (auVar23 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&(((QMakeProject *)auVar23)->super_QMakeEvaluator).m_caller)->d =
           *(int *)&((DataPointer *)&(((QMakeProject *)auVar23)->super_QMakeEvaluator).m_caller)->d
           + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&(((QMakeProject *)auVar23)->super_QMakeEvaluator).m_caller)->d
          == 0) {
        QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
      }
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  ppQVar29 = ppQVar26;
  if (bVar6 == false) {
    pQVar21 = *ppQVar26;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_APP_FLAG");
    bVar4 = QMakeProject::isEmpty(pQVar21,(ProKey *)local_78);
    bVar5 = true;
    pQVar21 = pQVar9;
    if (bVar4) {
      pQVar21 = *ppQVar26;
      QVar38.m_data = (storage_type *)0x3;
      QVar38.m_size = (qsizetype)local_b8;
      QString::fromUtf8(QVar38);
      auVar23 = local_b8;
      config_02.m_data = (storage_type_conflict *)pQStack_b0;
      config_02.m_size = (qsizetype)local_a8.d.ptr;
      bVar5 = QMakeEvaluator::isActiveConfig(&pQVar21->super_QMakeEvaluator,config_02,false);
      pQVar21 = pQVar9;
      if (auVar23 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
          pQVar21 = pQVar9;
        }
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (bVar5 != false) {
      ProStringList::removeAll((ProStringList *)pQVar21,"staticlib");
    }
  }
  else {
    qVar17 = QtPrivate::indexOf<ProString,char[4]>
                       ((QList<ProString> *)pQVar9,(char (*) [4])0x2b4554,0);
    pQVar21 = pQVar9;
    if (qVar17 == -1) {
      ProString::ProString((ProString *)local_78,"dll");
      pQVar21 = pQVar9;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar9,
                 (qsizetype)(pQVar9->super_QMakeEvaluator).m_current.pro,(ProString *)local_78);
      QList<ProString>::end((QList<ProString> *)pQVar9);
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
    }
  }
  pQVar9 = *ppQVar26;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_INCREMENTAL");
  bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar9 = *ppQVar29;
  if (bVar4) {
    ProKey::ProKey((ProKey *)local_78,"QMAKE_LFLAGS_PREBIND");
    bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
    ppQVar26 = ppQVar29;
    if (bVar4) {
      bVar4 = false;
    }
    else {
      pQVar9 = *ppQVar29;
      ProKey::ProKey((ProKey *)local_b8,"QMAKE_LIB_FLAG");
      pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
      if ((pPVar18->super_QList<ProString>).d.size == 0) {
        bVar4 = false;
      }
      else {
        pQVar9 = *ppQVar29;
        QVar39.m_data = (storage_type *)0x3;
        QVar39.m_size = (qsizetype)local_e8;
        QString::fromUtf8(QVar39);
        auVar23 = local_e8;
        config_03.m_data = (storage_type_conflict *)pQStack_e0;
        config_03.m_size = (qsizetype)local_d8.d.ptr;
        bVar4 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_03,false);
        if (auVar23 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
          }
        }
      }
      if (local_b8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
        }
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (bVar4 != false) {
      pQVar9 = *ppQVar29;
      pcVar27 = "QMAKE_LFLAGS_PREBIND";
      goto LAB_001a5925;
    }
  }
  else {
    pcVar27 = "QMAKE_LFLAGS_INCREMENTAL";
    ppQVar26 = ppQVar29;
LAB_001a5925:
    ProKey::ProKey((ProKey *)local_78,pcVar27);
    pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
    pQVar9 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_b8,"QMAKE_LFLAGS");
    pPVar19 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
    pPVar1 = (pPVar18->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar19,pPVar1,
               pPVar1 + (pPVar18->super_QList<ProString>).d.size);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  pQVar9 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_INCDIR_POST");
  pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
  pQVar9 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_INCDIR");
  pPVar19 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
  pPVar1 = (pPVar18->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar19,pPVar1,
             pPVar1 + (pPVar18->super_QList<ProString>).d.size);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar9 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHDIR_POST");
  pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
  pQVar9 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_RPATHDIR");
  pPVar19 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
  pPVar1 = (pPVar18->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar19,pPVar1,
             pPVar1 + (pPVar18->super_QList<ProString>).d.size);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar9 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHLINKDIR_POST");
  pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
  pQVar9 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_RPATHLINKDIR");
  pPVar19 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
  pPVar1 = (pPVar18->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)pPVar19,pPVar1,
             pPVar1 + (pPVar18->super_QList<ProString>).d.size);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar9 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_INCDIR");
  bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (!bVar4) {
    pQVar9 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_INCDIR");
    pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
    pQVar9 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_b8,"INCLUDEPATH");
    pPVar19 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
    pPVar1 = (pPVar18->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)pPVar19,pPVar1,
               pPVar1 + (pPVar18->super_QList<ProString>).d.size);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  local_1f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_1f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_1f8.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = (this->super_MakefileGenerator).project;
  pUVar67 = this;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_LIBDIR_FLAGS");
  pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
  ProKey::ProKey((ProKey *)local_b8,"QMAKE_LIBDIR");
  libdirToFlags((ProStringList *)local_e8,this,(ProKey *)local_b8);
  local_1f8.d = (pPVar18->super_QList<ProString>).d.d;
  local_1f8.ptr = (pPVar18->super_QList<ProString>).d.ptr;
  local_1f8.size = (pPVar18->super_QList<ProString>).d.size;
  if ((QMakeEvaluator *)local_1f8.d != (QMakeEvaluator *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&((DataPointer *)&((QMakeEvaluator *)local_1f8.d)->m_caller)->d)->_q_value)
    .super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&((DataPointer *)&((QMakeEvaluator *)local_1f8.d)->m_caller)->d)->
         _q_value).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)&local_1f8,(ProString *)pQStack_e0,
             (ProString *)(&(pQStack_e0->super_QMakeEvaluator).m_caller + (long)local_d8.d.ptr * 6))
  ;
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_e8);
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  local_218.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_218.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_218.ptr = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_LIBDIR_POST");
  libdirToFlags((ProStringList *)&local_218,pUVar67,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  pQVar9 = *ppQVar29;
  QVar40.m_data = (storage_type *)0x3;
  QVar40.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar40);
  auVar23 = local_78;
  config_04.m_data = (storage_type_conflict *)auStack_70._0_8_;
  config_04.m_size = auStack_70._8_8_;
  bVar4 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_04,false);
  if (auVar23 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
    }
  }
  ppQVar29 = ppQVar26;
  if (bVar4) {
    pQVar9 = *ppQVar26;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_FRAMEWORKPATH");
    bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if (!bVar4) {
      pQVar9 = *ppQVar26;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_FRAMEWORKPATH");
      pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if ((pPVar18->super_QList<ProString>).d.size != 0) {
        lVar24 = 0;
        uVar31 = 0;
        do {
          pUVar68 = pUVar67;
          MakefileGenerator::escapeFilePath
                    ((ProString *)local_e8,&pUVar67->super_MakefileGenerator,
                     (ProString *)
                     ((long)&(((pPVar18->super_QList<ProString>).d.ptr)->m_string).d.d + lVar24));
          local_78 = (undefined1  [8])anon_var_dwarf_a1af0;
          ProString::ProString((ProString *)auStack_70,(ProString *)local_e8);
          ProString::ProString<char_const(&)[3],ProString>
                    ((ProString *)local_b8,(QStringBuilder<const_char_(&)[3],_ProString> *)local_78)
          ;
          pQVar9 = (pUVar67->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_118,"QMAKE_FRAMEWORKPATH_FLAGS");
          pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_118)->
                     super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_b8)
          ;
          QList<ProString>::end(pQVar12);
          pUVar67 = pUVar68;
          if (local_118 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_118,2,0x10);
              pUVar67 = pUVar68;
            }
          }
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          if ((QMakeProject *)auStack_70._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_70._0_8_)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_70._0_8_)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_70._0_8_)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)auStack_70._0_8_,2,0x10);
            }
          }
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
            }
          }
          uVar31 = uVar31 + 1;
          lVar24 = lVar24 + 0x30;
        } while (uVar31 < (ulong)(pPVar18->super_QList<ProString>).d.size);
      }
    }
    pQVar9 = *ppQVar26;
    ppQVar29 = ppQVar26;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_FRAMEWORKPATH_FLAGS");
    pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
    pPVar1 = (pPVar18->super_QList<ProString>).d.ptr;
    QtPrivate::QCommonArrayOps<ProString>::growAppend
              ((QCommonArrayOps<ProString> *)&local_1f8,pPVar1,
               pPVar1 + (pPVar18->super_QList<ProString>).d.size);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  pQVar9 = *ppQVar26;
  ProKey::ProKey((ProKey *)local_78,"LIBS");
  pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  local_b8 = (undefined1  [8])local_1f8.d;
  pQStack_b0 = (QMakeProject *)local_1f8.ptr;
  local_a8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )local_1f8.size;
  if ((QMakeEvaluator *)local_1f8.d != (QMakeEvaluator *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&((DataPointer *)&(local_1f8.d)->super_QArrayData)->d)->_q_value).
    super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&((DataPointer *)&(local_1f8.d)->super_QArrayData)->d)->_q_value).
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPVar1 = (pPVar18->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)local_b8,pPVar1,
             pPVar1 + (pPVar18->super_QList<ProString>).d.size);
  QVar28.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )local_a8;
  pQVar9 = pQStack_b0;
  auVar23 = local_b8;
  local_a8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
          *)0x0;
  local_b8 = (undefined1  [8])0x0;
  pQStack_b0 = (QMakeProject *)0x0;
  local_78 = (undefined1  [8])(pPVar18->super_QList<ProString>).d.d;
  auStack_70._0_8_ = (pPVar18->super_QList<ProString>).d.ptr;
  (pPVar18->super_QList<ProString>).d.d = (Data *)auVar23;
  (pPVar18->super_QList<ProString>).d.ptr = (ProString *)pQVar9;
  auStack_70._8_8_ = (pPVar18->super_QList<ProString>).d.size;
  (pPVar18->super_QList<ProString>).d.size = (qsizetype)QVar28.d.ptr;
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_78);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_b8);
  pQVar9 = *ppQVar26;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_LIBS");
  pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_78)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  local_b8 = (undefined1  [8])local_218.d;
  pQStack_b0 = (QMakeProject *)local_218.ptr;
  local_a8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )local_218.size;
  if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
       )local_218.d !=
      (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_218.d = *(int *)local_218.d + 1;
    UNLOCK();
  }
  pPVar1 = (pPVar18->super_QList<ProString>).d.ptr;
  QtPrivate::QCommonArrayOps<ProString>::growAppend
            ((QCommonArrayOps<ProString> *)local_b8,pPVar1,
             pPVar1 + (pPVar18->super_QList<ProString>).d.size);
  QVar28.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )local_a8;
  pQVar9 = pQStack_b0;
  auVar23 = local_b8;
  local_a8.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
        )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
          *)0x0;
  local_b8 = (undefined1  [8])0x0;
  pQStack_b0 = (QMakeProject *)0x0;
  local_78 = (undefined1  [8])(pPVar18->super_QList<ProString>).d.d;
  auStack_70._0_8_ = (pPVar18->super_QList<ProString>).d.ptr;
  (pPVar18->super_QList<ProString>).d.d = (Data *)auVar23;
  (pPVar18->super_QList<ProString>).d.ptr = (ProString *)pQVar9;
  auStack_70._8_8_ = (pPVar18->super_QList<ProString>).d.size;
  (pPVar18->super_QList<ProString>).d.size = (qsizetype)QVar28.d.ptr;
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_78);
  QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_b8);
  pQVar9 = *ppQVar26;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHDIR");
  bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
  if (bVar4) {
    bVar4 = false;
  }
  else {
    pQVar9 = *ppQVar26;
    ProKey::ProKey((ProKey *)local_b8,"QMAKE_LFLAGS_RPATH");
    bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_b8);
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    bVar4 = !bVar4;
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (bVar4) {
    pQVar9 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHDIR");
    pQVar9 = (QMakeProject *)
             QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if ((pQVar9->super_QMakeEvaluator).m_current.pro != (ProFile *)0x0) {
      lVar24 = 0;
      pPVar25 = (ProFile *)0x0;
      pQVar21 = pQVar9;
      do {
        local_138.d.ptr = (totally_ordered_wrapper<QMakeFeatureRoots_*>)&DAT_aaaaaaaaaaaaaaaa;
        local_148 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        pQStack_140 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
        ProString::toQString
                  ((QString *)local_148,
                   (ProString *)
                   ((long)*(char16_t **)&(pQVar9->super_QMakeEvaluator).m_debugLevel + lVar24));
        if ((((ulong)local_138.d.ptr < (QMakeFeatureRoots *)0x2) ||
            (*(short *)&(((QString *)&(pQStack_140->super_QMakeEvaluator).m_caller)->d).d != 0x24))
           || (*(short *)((long)&(((QString *)&(pQStack_140->super_QMakeEvaluator).m_caller)->d).d +
                         2) == 0x28)) {
          cVar7 = QString::startsWith((QChar)(char16_t)(QString *)local_148,0x40);
          if (cVar7 != '\0') goto LAB_001a68a9;
          local_230 = (QMakeProject *)local_148;
          local_228 = pQStack_140;
          tStack_220 = local_138.d.ptr;
          if (local_148 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d + 1;
            UNLOCK();
          }
          file.d.ptr = (char16_t *)pUVar67;
          file.d.d = (Data *)ppQVar29;
          file.d.size = (qsizetype)pQVar21;
          MakefileGenerator::fileInfo((MakefileGenerator *)local_78,file);
          cVar7 = QFileInfo::isRelative();
          QFileInfo::~QFileInfo((QFileInfo *)local_78);
          pQVar9 = pQVar21;
          if (local_230 != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)&(local_230->super_QMakeEvaluator).m_caller)->d =
                 *(int *)&((DataPointer *)&(local_230->super_QMakeEvaluator).m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&(local_230->super_QMakeEvaluator).m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_230,2,0x10);
              pQVar9 = pQVar21;
            }
          }
          pQVar21 = pQVar9;
          if (cVar7 == '\0') goto LAB_001a68a9;
          local_d8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )&DAT_aaaaaaaaaaaaaaaa;
          local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          pQStack_e0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar21 = *ppQVar29;
          ProKey::ProKey((ProKey *)local_b8,"QMAKE_REL_RPATH_BASE");
          QMakeEvaluator::first
                    ((ProString *)local_78,&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8);
          ProString::toQString((QString *)local_e8,(ProString *)local_78);
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          auVar23 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          QVar28.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                          )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                            )local_d8;
          if (local_d8.d.ptr ==
              (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
               *)0x0) {
            init(local_248);
          }
          else {
            cVar7 = QString::startsWith((QChar)(char16_t)local_e8,0x24);
            ppQVar26 = ppQVar29;
            if (cVar7 != '\0') {
              QVar41.m_data = (storage_type *)0x3;
              QVar41.m_size = (qsizetype)local_78;
              QString::fromUtf8(QVar41);
              local_b8 = local_78;
              pQStack_b0 = (QMakeProject *)auStack_70._0_8_;
              local_a8.d.ptr =
                   (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                      )auStack_70._8_8_;
              QString::replace((longlong)local_e8,0,(QString *)0x1);
              ppQVar26 = ppQVar29;
              if (local_b8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                  ppQVar26 = ppQVar29;
                }
              }
            }
            bVar4 = comparesEqual((QString *)local_148,".");
            if (bVar4) {
              QString::operator=((QString *)local_148,(QString *)local_e8);
            }
            else {
              local_b8 = (undefined1  [8])local_e8;
              pQStack_b0 = (QMakeProject *)CONCAT71(pQStack_b0._1_7_,0x2f);
              QStringBuilder<QString_&,_char>::convertTo<QString>
                        ((QString *)local_78,(QStringBuilder<QString_&,_char> *)local_b8);
              pQVar21 = (QMakeProject *)auStack_70._0_8_;
              if ((QMakeProject *)auStack_70._0_8_ == (QMakeProject *)0x0) {
                pQVar21 = (QMakeProject *)&QString::_empty;
              }
              QString::insert((longlong)local_148,(QChar *)0x0,(longlong)pQVar21);
              if (local_78 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78,2,0x10);
                }
              }
            }
            pQVar21 = *ppQVar26;
            ppQVar29 = ppQVar26;
            ProKey::ProKey((ProKey *)local_78,"QMAKE_LFLAGS");
            pPVar18 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_78);
            pQVar21 = *ppQVar26;
            ProKey::ProKey((ProKey *)local_b8,"QMAKE_LFLAGS_REL_RPATH");
            pPVar19 = QMakeEvaluator::valuesRef(&pQVar21->super_QMakeEvaluator,(ProKey *)local_b8);
            ProStringList::insertUnique(pPVar18,pPVar19);
            auVar23 = local_b8;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
          }
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
            }
          }
          pQVar21 = pQVar9;
          if (QVar28.d.ptr !=
              (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
               *)0x0) goto LAB_001a68a9;
        }
        else {
          QVar42.m_data = (storage_type *)0x3;
          QVar42.m_size = (qsizetype)local_78;
          QString::fromUtf8(QVar42);
          local_b8 = local_78;
          pQStack_b0 = (QMakeProject *)auStack_70._0_8_;
          local_a8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )auStack_70._8_8_;
          QString::replace((longlong)local_148,0,(QString *)0x1);
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
LAB_001a68a9:
          ProKey::ProKey((ProKey *)local_e8,"QMAKE_LFLAGS_RPATH");
          pUVar68 = pUVar67;
          (*(pUVar67->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0x16])(local_2d8,pUVar67,(ProKey *)local_e8);
          (*(pUVar67->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0xc])(&local_308,pUVar67,local_148);
          local_a8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )local_2c8;
          pQStack_b0 = pQStack_2d0;
          local_b8 = local_2d8;
          local_90.d = (Data *)local_308.super_ProString.m_string.d.size;
          PStack_98.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                  )local_308.super_ProString.m_string.d.ptr;
          pQStack_a0 = (QMakeProject *)local_308.super_ProString.m_string.d.d;
          local_2d8 = (undefined1  [8])0x0;
          pQStack_2d0 = (QMakeProject *)0x0;
          local_2c8.ptr = (QMakeFeatureRoots *)0x0;
          local_308.super_ProString.m_string.d.d = (Data *)0x0;
          local_308.super_ProString.m_string.d.ptr = (char16_t *)0x0;
          local_308.super_ProString.m_string.d.size = 0;
          ProString::ProString<QString,QString>
                    ((ProString *)local_78,(QStringBuilder<QString,_QString> *)local_b8);
          pQVar9 = (pUVar67->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_118,"QMAKE_LFLAGS");
          pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_118)->
                     super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_78)
          ;
          QList<ProString>::end(pQVar12);
          pUVar67 = pUVar68;
          pQVar9 = pQVar21;
          if (local_118 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_118,2,0x10);
              pUVar67 = pUVar68;
              pQVar9 = pQVar21;
            }
          }
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          QStringBuilder<QString,_QString>::~QStringBuilder
                    ((QStringBuilder<QString,_QString> *)local_b8);
          pQVar21 = pQVar9;
          if ((QMakeProject *)local_308.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_308.super_ProString.m_string.d.d)->super_QArrayData
                      )->m_caller)->d =
                 *(int *)&((DataPointer *)
                          &((QMakeEvaluator *)
                           &(local_308.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->
                          d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)
                         &((QMakeEvaluator *)
                          &(local_308.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
                == 0) {
              QArrayData::deallocate
                        (&(local_308.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (local_2d8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8,2,0x10);
            }
          }
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
            }
          }
        }
        if (local_148 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_148,2,0x10);
          }
        }
        pPVar25 = (ProFile *)((long)&(pPVar25->m_refCount).m_cnt + 1);
        lVar24 = lVar24 + 0x30;
      } while (pPVar25 < (pQVar9->super_QMakeEvaluator).m_current.pro);
    }
  }
  pQVar9 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHLINKDIR");
  bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  if (!bVar4) {
    pQVar9 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_RPATHLINKDIR");
    pQVar9 = (QMakeProject *)
             QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if ((pQVar9->super_QMakeEvaluator).m_current.pro != (ProFile *)0x0) {
      lVar24 = 0;
      pPVar25 = (ProFile *)0x0;
      pQVar21 = pQVar9;
      do {
        this_00 = *ppQVar29;
        ProKey::ProKey((ProKey *)local_78,"QMAKE_LFLAGS_RPATHLINK");
        bVar4 = QMakeProject::isEmpty(this_00,(ProKey *)local_78);
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (!bVar4) {
          ProKey::ProKey((ProKey *)local_e8,"QMAKE_LFLAGS_RPATHLINK");
          pUVar68 = pUVar67;
          (*(pUVar67->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0x16])(local_148,pUVar67,(ProKey *)local_e8);
          ProString::toQString
                    ((QString *)local_268,
                     (ProString *)
                     ((long)*(char16_t **)&(pQVar9->super_QMakeEvaluator).m_debugLevel + lVar24));
          QFileInfo::QFileInfo((QFileInfo *)&local_288,(QString *)local_268);
          QFileInfo::absoluteFilePath();
          (*(pUVar67->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0xc])(local_2d8,pUVar67,&local_308);
          local_a8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )local_138.d.ptr;
          pQStack_b0 = pQStack_140;
          local_b8 = local_148;
          local_90.d = (Data *)local_2c8;
          PStack_98.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                  )pQStack_2d0;
          pQStack_a0 = (QMakeProject *)local_2d8;
          local_148 = (undefined1  [8])0x0;
          pQStack_140 = (QMakeProject *)0x0;
          local_138.d.ptr = (totally_ordered_wrapper<QMakeFeatureRoots_*>)(QMakeFeatureRoots *)0x0;
          local_2d8 = (undefined1  [8])0x0;
          pQStack_2d0 = (QMakeProject *)0x0;
          local_2c8.ptr = (QMakeFeatureRoots *)0x0;
          ProString::ProString<QString,QString>
                    ((ProString *)local_78,(QStringBuilder<QString,_QString> *)local_b8);
          pQVar9 = (pUVar67->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_118,"QMAKE_LFLAGS");
          pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_118)->
                     super_QList<ProString>;
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_78)
          ;
          QList<ProString>::end(pQVar12);
          pUVar67 = pUVar68;
          pQVar9 = pQVar21;
          if (local_118 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_118,2,0x10);
              pUVar67 = pUVar68;
              pQVar9 = pQVar21;
            }
          }
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          QStringBuilder<QString,_QString>::~QStringBuilder
                    ((QStringBuilder<QString,_QString> *)local_b8);
          pQVar21 = pQVar9;
          if (local_2d8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8,2,0x10);
            }
          }
          if ((QMakeProject *)local_308.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&((DataPointer *)
                     &((QMakeEvaluator *)&(local_308.super_ProString.m_string.d.d)->super_QArrayData
                      )->m_caller)->d =
                 *(int *)&((DataPointer *)
                          &((QMakeEvaluator *)
                           &(local_308.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->
                          d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)
                         &((QMakeEvaluator *)
                          &(local_308.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
                == 0) {
              QArrayData::deallocate
                        (&(local_308.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          QFileInfo::~QFileInfo((QFileInfo *)&local_288);
          if (local_268 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_268,2,0x10);
            }
          }
          if (local_148 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_148,2,0x10);
            }
          }
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
            }
          }
        }
        pPVar25 = (ProFile *)((long)&(pPVar25->m_refCount).m_cnt + 1);
        lVar24 = lVar24 + 0x30;
      } while (pPVar25 < (pQVar9->super_QMakeEvaluator).m_current.pro);
    }
  }
  pQVar9 = *ppQVar29;
  QVar43.m_data = (storage_type *)0x7;
  QVar43.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar43);
  auVar23 = local_78;
  bVar4 = false;
  config_05.m_data = (storage_type_conflict *)auStack_70._0_8_;
  config_05.m_size = auStack_70._8_8_;
  QVar28.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )auStack_70._8_8_;
  bVar5 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_05,false);
  if (bVar5) {
    pQVar9 = *ppQVar29;
    QVar28.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )local_78;
    ProKey::ProKey((ProKey *)QVar28.d.ptr,"QMAKE_CFLAGS_DEPS");
    bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)QVar28.d.ptr);
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QVar28.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                        )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                          *)0x2;
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    bVar4 = !bVar4;
  }
  if (auVar23 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
      QVar28.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                      )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                        *)0x2;
      QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
    }
  }
  if (bVar4) {
    pUVar67->include_deps = true;
  }
  pUVar68 = pUVar67;
  MakefileGenerator::init(&pUVar67->super_MakefileGenerator,(EVP_PKEY_CTX *)QVar28.d.ptr);
  pQVar9 = (pUVar67->super_MakefileGenerator).project;
  QVar44.m_data = (storage_type *)0xb;
  QVar44.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar44);
  auVar23 = local_78;
  config_06.m_data = (storage_type_conflict *)auStack_70._0_8_;
  config_06.m_size = auStack_70._8_8_;
  bVar4 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_06,false);
  if (auVar23 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
    }
  }
  if (bVar4) {
    pQVar9 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_BUILTIN_COMPILERS");
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)->
               super_QList<ProString>;
    ProString::ProString((ProString *)local_b8,"OBJC");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_b8);
    QList<ProString>::end(pQVar12);
    ProString::ProString((ProString *)local_e8,"OBJCXX");
    QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
              ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_e8);
    QList<ProString>::end(pQVar12);
    if (local_e8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
      }
    }
    auVar23 = local_b8;
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  pQVar9 = *ppQVar29;
  ProKey::ProKey((ProKey *)local_78,"QMAKE_BUILTIN_COMPILERS");
  pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)->
             super_QList<ProString>;
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  iVar14 = QList<ProString>::begin(pQVar12);
  iVar15 = QList<ProString>::end(pQVar12);
  for (; iVar14.i != iVar15.i;
      iVar14.i = (ProString *)
                 &(((QMakeProject *)iVar14.i)->super_QMakeEvaluator).m_locationStack.
                  super_QList<QMakeEvaluator::Location>.d.size) {
    local_308.super_ProString.m_string.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_308.super_ProString.m_string.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_308.super_ProString.m_string.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_COMPILE_FLAG");
    (*(pUVar68->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16])
              (&local_308,pUVar68,(ProKey *)local_78);
    auVar23 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    if ((QMakeProject *)local_308.super_ProString.m_string.d.size == (QMakeProject *)0x0) {
      QVar45.m_size = (size_t)"-c";
      QVar45.field_0.m_data = &local_308;
      QString::assign(QVar45);
    }
    iVar8 = (*(pUVar68->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0x21])();
    if ((char)iVar8 != '\0') {
      pQVar9 = *ppQVar29;
      ProKey::ProKey((ProKey *)local_78,"PRECOMPILED_HEADER");
      bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
      auVar23 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if (!bVar4) {
        local_108 = (ProFile *)&DAT_aaaaaaaaaaaaaaaa;
        local_118 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        pPStack_110 = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8 = (undefined1  [8])0x2aceb2;
        local_a8.d.ptr =
             (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
              )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                *)0x2ae371;
        pQStack_b0 = (QMakeProject *)iVar14.i;
        ProString::ProString<QStringBuilder<char_const(&)[7],ProString_const&>,char_const(&)[21]>
                  ((ProString *)local_78,
                   (QStringBuilder<QStringBuilder<const_char_(&)[7],_const_ProString_&>,_const_char_(&)[21]>
                    *)local_b8);
        (*(pUVar68->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
          [0x16])(local_118,pUVar68,(ProString *)local_78);
        auVar23 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        local_148 = (undefined1  [8])0x0;
        pQStack_140 = (QMakeProject *)0x0;
        local_138.d.ptr = (totally_ordered_wrapper<QMakeFeatureRoots_*>)(QMakeFeatureRoots *)0x0;
        pQVar9 = *ppQVar29;
        ProKey::ProKey((ProKey *)local_78,"PRECOMPILED_DIR");
        bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
        auVar23 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (!bVar4) {
          pQVar9 = *ppQVar29;
          ProKey::ProKey((ProKey *)local_b8,"PRECOMPILED_DIR");
          QMakeEvaluator::first
                    ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
          ProString::toQString((QString *)local_268,(ProString *)local_78);
          local_e8 = local_268;
          pQStack_e0 = pQStack_260;
          local_d8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )pQStack_258;
          if (local_268 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d + 1;
            UNLOCK();
          }
          string.d.ptr = (char16_t *)pUVar68;
          string.d.d = (Data *)ppQVar29;
          string.d.size = (qsizetype)pQVar21;
          Option::fixString((QString *)local_2d8,string,(uchar)(ProFile *)local_e8);
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
            }
          }
          pQVar9 = pQStack_140;
          auVar30 = local_148;
          tVar2.ptr = local_2c8.ptr;
          auVar23 = local_2d8;
          local_2d8 = local_148;
          local_148 = auVar23;
          pQStack_140 = pQStack_2d0;
          pQStack_2d0 = pQVar9;
          local_2c8 = local_138.d.ptr;
          local_138.d.ptr =
               (totally_ordered_wrapper<QMakeFeatureRoots_*>)
               (totally_ordered_wrapper<QMakeFeatureRoots_*>)tVar2.ptr;
          if (auVar30 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)auVar30,2,0x10);
            }
          }
          if (local_268 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_268,2,0x10);
            }
          }
          auVar23 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          cVar7 = QString::endsWith((QString *)local_148,0x2e5bf0);
          if (cVar7 == '\0') {
            QString::append((QString *)local_148);
          }
        }
        pQVar9 = *ppQVar29;
        ProKey::ProKey((ProKey *)local_b8,"QMAKE_ORIG_TARGET");
        QMakeEvaluator::first
                  ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
        ProString::toQString((QString *)local_e8,(ProString *)local_78);
        QString::append((QString *)local_148);
        if (local_e8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
          }
        }
        auVar23 = local_78;
        ppQVar26 = ppQVar29;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        pQVar9 = (pUVar68->super_MakefileGenerator).project;
        pUVar67 = pUVar68;
        ProKey::ProKey((ProKey *)local_b8,"PRECOMPILED_HEADER");
        QMakeEvaluator::first
                  ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
        ProString::toQString((QString *)local_2d8,(ProString *)local_78);
        (*(pUVar68->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
          [0xc])((ProFile *)local_e8,pUVar68,(QString *)local_2d8);
        QVar46.m_data = (char *)0x12;
        QVar46.m_size = (qsizetype)local_118;
        QString::replace(QVar46,(QString *)"${QMAKE_PCH_INPUT}",(CaseSensitivity)(ProFile *)local_e8
                        );
        if (local_e8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
          }
        }
        pQVar21 = (QMakeProject *)iVar14.i;
        if (local_2d8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8,2,0x10);
          }
        }
        auVar23 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        (*(pUVar67->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
          [0xc])((QStringBuilder<QString_&,_ProString> *)local_78,pUVar67,local_148);
        QVar47.m_data = (char *)0x18;
        QVar47.m_size = (qsizetype)local_118;
        QString::replace(QVar47,(QString *)"${QMAKE_PCH_OUTPUT_BASE}",
                         (CaseSensitivity)(QStringBuilder<QString_&,_ProString> *)local_78);
        auVar23 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        pQVar9 = *ppQVar29;
        QVar48.m_data = (storage_type *)0xd;
        QVar48.m_size = (qsizetype)local_78;
        QString::fromUtf8(QVar48);
        auVar23 = local_78;
        config_07.m_data = (storage_type_conflict *)auStack_70._0_8_;
        config_07.m_size = auStack_70._8_8_;
        bVar4 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_07,false);
        if (auVar23 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
          }
        }
        if (bVar4) {
          pQVar9 = (pUVar67->super_MakefileGenerator).project;
          pUVar68 = pUVar67;
          ProKey::ProKey((ProKey *)local_e8,"QMAKE_PCH_OUTPUT_EXT");
          QMakeEvaluator::first
                    ((ProString *)local_b8,&pQVar9->super_QMakeEvaluator,(ProKey *)local_e8);
          local_78 = (undefined1  [8])local_148;
          ProString::ProString((ProString *)auStack_70,(ProString *)local_b8);
          MakefileGenerator::escapeFilePath<QString&,ProString>
                    ((QString *)local_2d8,&pUVar67->super_MakefileGenerator,
                     (QStringBuilder<QString_&,_ProString> *)local_78);
          QVar49.m_data = (char *)0x13;
          QVar49.m_size = (qsizetype)local_118;
          QString::replace(QVar49,(QString *)"${QMAKE_PCH_OUTPUT}",
                           (CaseSensitivity)(QString *)local_2d8);
          ppQVar29 = ppQVar26;
          if (local_2d8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8,2,0x10);
            }
          }
          uVar22 = auStack_70._0_8_;
          if ((QMakeProject *)auStack_70._0_8_ != (QMakeProject *)0x0) {
            LOCK();
            *(int *)&(((QString *)&((QMakeEvaluator *)auStack_70._0_8_)->m_caller)->d).d =
                 *(int *)&(((QString *)&((QMakeEvaluator *)auStack_70._0_8_)->m_caller)->d).d + -1;
            UNLOCK();
            if (*(int *)&(((QString *)&((QMakeEvaluator *)uVar22)->m_caller)->d).d == 0) {
              QArrayData::deallocate((QArrayData *)auStack_70._0_8_,2,0x10);
            }
          }
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
            }
          }
          local_d8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )&DAT_aaaaaaaaaaaaaaaa;
          local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          pQStack_e0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
          pQVar9 = *ppQVar26;
          ProKey::ProKey((ProKey *)local_78,"QMAKE_PCH_ARCHS");
          pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
          auVar23 = local_78;
          local_e8 = (undefined1  [8])(pPVar18->super_QList<ProString>).d.d;
          pQStack_e0 = (QMakeProject *)(pPVar18->super_QList<ProString>).d.ptr;
          local_d8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )(pPVar18->super_QList<ProString>).d.size;
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&(((QMakeProject *)local_e8)->super_QMakeEvaluator).m_caller)->
                     d = *(int *)&((DataPointer *)
                                  &(((QMakeProject *)local_e8)->super_QMakeEvaluator).m_caller)->d +
                         1;
            UNLOCK();
          }
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (local_d8.d.ptr !=
              (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
               *)0x0) {
            lVar24 = (long)local_d8.d.ptr * 0x30;
            QVar28.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                            )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                              )pQStack_e0;
            do {
              local_2c8.ptr = (QMakeFeatureRoots *)&DAT_aaaaaaaaaaaaaaaa;
              local_2d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
              pQStack_2d0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
              pQVar9 = *ppQVar26;
              ProKey::ProKey((ProKey *)local_b8,"QMAKE_PCH_OUTPUT_EXT");
              QMakeEvaluator::first
                        ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
              ProString::toQString((QString *)local_2d8,(ProString *)local_78);
              auVar23 = local_78;
              ppQVar26 = ppQVar29;
              if (local_78 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78,2,0x10);
                  ppQVar26 = ppQVar29;
                }
              }
              if (local_b8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                }
              }
              ProString::toQString((QString *)local_78,(ProString *)QVar28.d.ptr);
              QVar50.m_data = (char *)0x11;
              QVar50.m_size = (qsizetype)local_2d8;
              QString::replace(QVar50,(QString *)"${QMAKE_PCH_ARCH}",
                               (CaseSensitivity)(QString *)local_78);
              auVar23 = local_78;
              if (local_78 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78,2,0x10);
                }
              }
              local_78 = (undefined1  [8])0x13;
              auStack_70._0_8_ = "${QMAKE_PCH_OUTPUT_";
              auStack_70[0x10] = 0x7d;
              auStack_70._8_8_ = QVar28.d.ptr;
              QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>::
              convertTo<QString>((QString *)local_b8,
                                 (QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>
                                  *)local_78);
              local_288.d.d = (Data *)local_148;
              local_288.d.ptr = (char16_t *)local_2d8;
              MakefileGenerator::escapeFilePath<QString&,QString&>
                        ((QString *)local_268,&pUVar68->super_MakefileGenerator,
                         (QStringBuilder<QString_&,_QString_&> *)&local_288);
              QString::replace((QString *)local_118,(QString *)local_b8,
                               (CaseSensitivity)(QString *)local_268);
              ppQVar29 = ppQVar26;
              if (local_268 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_268,2,0x10);
                }
              }
              if (local_b8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                }
              }
              if (local_2d8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_2d8,2,0x10);
                }
              }
              QVar28.d.ptr = (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                              )((long)QVar28.d.ptr + 0x30);
              lVar24 = lVar24 + -0x30;
            } while (lVar24 != 0);
          }
          QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_e8)
          ;
        }
        else {
          local_e8 = (undefined1  [8])0x0;
          pQStack_e0 = (QMakeProject *)0x0;
          local_d8.d.ptr =
               (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                )(QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
                  *)0x0;
          pQVar9 = *ppQVar26;
          QVar51.m_data = (storage_type *)0xf;
          QVar51.m_size = (qsizetype)local_78;
          QString::fromUtf8(QVar51);
          auVar23 = local_78;
          config_08.m_data = (storage_type_conflict *)auStack_70._0_8_;
          config_08.m_size = auStack_70._8_8_;
          bVar4 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_08,false);
          ppQVar29 = ppQVar26;
          pUVar68 = pUVar67;
          if (auVar23 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
              ppQVar29 = ppQVar26;
              pUVar68 = pUVar67;
            }
          }
          if (bVar4) {
            pQVar9 = *ppQVar29;
            ProKey::ProKey((ProKey *)local_b8,"QMAKE_PCH_OUTPUT_EXT");
            QMakeEvaluator::first
                      ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
            ProString::toQString((QString *)local_2d8,(ProString *)local_78);
            pQVar9 = pQStack_e0;
            auVar30 = local_e8;
            tVar2.ptr = local_2c8.ptr;
            auVar23 = local_2d8;
            local_2d8 = local_e8;
            local_e8 = auVar23;
            pQStack_e0 = pQStack_2d0;
            pQStack_2d0 = pQVar9;
            local_2c8.ptr = (QMakeFeatureRoots *)local_d8.d.ptr;
            local_d8.d.ptr =
                 (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                  )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                    )tVar2.ptr;
            if (auVar30 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)auVar30,2,0x10);
              }
            }
            auVar23 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
          }
          pQVar9 = *ppQVar29;
          ProKey::ProKey((ProKey *)local_b8,"QMAKE_PCH_OUTPUT_EXT");
          QMakeEvaluator::first
                    ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
          ProString::toQString((QString *)local_2d8,(ProString *)local_78);
          QString::append((QString *)local_148);
          if (local_2d8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_2d8,2,0x10);
            }
          }
          auVar23 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          QString::append((QString *)local_148);
          auStack_70._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_50 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
          auStack_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          auStack_70._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          auStack_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          pQVar9 = *ppQVar29;
          local_2d8 = (undefined1  [8])anon_var_dwarf_2befc5;
          pQStack_2d0 = (QMakeProject *)iVar14.i;
          ProString::ProString<char_const(&)[16],ProString_const&>
                    ((ProString *)local_b8,
                     (QStringBuilder<const_char_(&)[16],_const_ProString_&> *)local_2d8);
          QMakeEvaluator::first
                    ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          if (auStack_70._20_4_ != 0) {
            local_2d8 = (undefined1  [8])local_148;
            pQStack_2d0 = (QMakeProject *)local_78;
            local_2c8.ptr = (QMakeFeatureRoots *)local_e8;
            MakefileGenerator::escapeFilePath<QStringBuilder<QString&,ProString&>,QString&>
                      ((QString *)local_b8,&pUVar68->super_MakefileGenerator,
                       (QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&> *)
                       local_2d8);
            QVar52.m_data = (char *)0x13;
            QVar52.m_size = (qsizetype)local_118;
            QString::replace(QVar52,(QString *)"${QMAKE_PCH_OUTPUT}",
                             (CaseSensitivity)(ProString *)local_b8);
            ppQVar26 = ppQVar29;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                ppQVar26 = ppQVar29;
              }
            }
            local_2c8.ptr = (QMakeFeatureRoots *)&DAT_aaaaaaaaaaaaaaaa;
            local_2d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
            pQStack_2d0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
            pQVar9 = *ppQVar26;
            ppQVar29 = ppQVar26;
            ProKey::ProKey((ProKey *)local_b8,"QMAKE_PCH_ARCHS");
            pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
            local_2d8 = (undefined1  [8])(pPVar18->super_QList<ProString>).d.d;
            pQStack_2d0 = (QMakeProject *)(pPVar18->super_QList<ProString>).d.ptr;
            local_2c8.ptr = (QMakeFeatureRoots *)(pPVar18->super_QList<ProString>).d.size;
            if (local_2d8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&(((QMakeProject *)local_2d8)->super_QMakeEvaluator).m_caller
                       )->d =
                   *(int *)&((DataPointer *)
                            &(((QMakeProject *)local_2d8)->super_QMakeEvaluator).m_caller)->d + 1;
              UNLOCK();
            }
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
            if ((QMakeProject *)local_2c8.ptr != (QMakeProject *)0x0) {
              lVar24 = (long)local_2c8.ptr * 0x30;
              pQVar9 = pQStack_2d0;
              do {
                pQStack_258 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
                local_268 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
                pQStack_260 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
                local_b8 = (undefined1  [8])local_148;
                pQStack_b0 = (QMakeProject *)local_78;
                local_a8.d.ptr =
                     (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                      )local_e8;
                QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&>::
                convertTo<QString>((QString *)local_268,
                                   (QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&>
                                    *)local_b8);
                ProString::toQString((QString *)local_b8,(ProString *)pQVar9);
                QVar53.m_data = (char *)0x11;
                QVar53.m_size = (qsizetype)local_268;
                QString::replace(QVar53,(QString *)"${QMAKE_PCH_ARCH}",
                                 (CaseSensitivity)
                                 (QStringBuilder<QStringBuilder<QString_&,_ProString_&>,_QString_&>
                                  *)local_b8);
                auVar23 = local_b8;
                iVar14.i = (ProString *)pQVar21;
                if (local_b8 != (undefined1  [8])0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i =
                       ((__atomic_base<int> *)&(((QString *)local_b8)->d).d)->_M_i + -1;
                  UNLOCK();
                  iVar14.i = (ProString *)pQVar21;
                  if (((__atomic_base<int> *)&(((QString *)auVar23)->d).d)->_M_i == 0) {
                    QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                    iVar14.i = (ProString *)pQVar21;
                  }
                }
                pQVar21 = *ppQVar26;
                QVar54.m_data = (storage_type *)0xf;
                QVar54.m_size = (qsizetype)local_b8;
                QString::fromUtf8(QVar54);
                auVar23 = local_b8;
                config_09.m_data = (storage_type_conflict *)pQStack_b0;
                config_09.m_size = (qsizetype)local_a8.d.ptr;
                bVar4 = QMakeEvaluator::isActiveConfig
                                  (&pQVar21->super_QMakeEvaluator,config_09,false);
                if (bVar4) {
                  QVar55.m_data = (char *)0x4;
                  QVar55.m_size = (qsizetype)local_268;
                  cVar7 = QString::endsWith(QVar55,0x2b1e1c);
                  if (cVar7 == '\0') {
                    QVar56.m_data = (char *)0x4;
                    QVar56.m_size = (qsizetype)local_268;
                    cVar7 = QString::endsWith(QVar56,0x2ae43f);
                    if (auVar23 != (undefined1  [8])0x0) {
                      LOCK();
                      ((__atomic_base<int> *)&(((QString *)auVar23)->d).d)->_M_i =
                           ((__atomic_base<int> *)&(((QString *)auVar23)->d).d)->_M_i + -1;
                      UNLOCK();
                      if (((__atomic_base<int> *)&(((QString *)auVar23)->d).d)->_M_i == 0) {
                        QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
                      }
                    }
                    if (cVar7 == '\0') goto LAB_001a812a;
                  }
                  else if (auVar23 != (undefined1  [8])0x0) {
                    LOCK();
                    ((__atomic_base<int> *)&(((QString *)auVar23)->d).d)->_M_i =
                         ((__atomic_base<int> *)&(((QString *)auVar23)->d).d)->_M_i + -1;
                    UNLOCK();
                    if (((__atomic_base<int> *)&(((QString *)auVar23)->d).d)->_M_i == 0) {
                      QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
                    }
                  }
                  QString::chop((longlong)local_268);
                }
                else if (auVar23 != (undefined1  [8])0x0) {
                  LOCK();
                  ((__atomic_base<int> *)&(((QString *)auVar23)->d).d)->_M_i =
                       ((__atomic_base<int> *)&(((QString *)auVar23)->d).d)->_M_i + -1;
                  UNLOCK();
                  if (((__atomic_base<int> *)&(((QString *)auVar23)->d).d)->_M_i == 0) {
                    QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
                  }
                }
LAB_001a812a:
                local_b8 = (undefined1  [8])0x13;
                pQStack_b0 = (QMakeProject *)0x2ae40b;
                pQStack_a0 = (QMakeProject *)CONCAT71(pQStack_a0._1_7_,0x7d);
                local_a8.d.ptr =
                     (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                      )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                        )pQVar9;
                QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>::
                convertTo<QString>(&local_288,
                                   (QStringBuilder<QStringBuilder<QLatin1String,_const_ProString_&>,_QLatin1Char>
                                    *)local_b8);
                (*(pUVar68->super_MakefileGenerator).super_QMakeSourceFileInfo.
                  _vptr_QMakeSourceFileInfo[0xc])(local_2a0,pUVar68,local_268);
                QString::replace((QString *)local_118,(QString *)&local_288,
                                 (CaseSensitivity)local_2a0);
                ppQVar26 = ppQVar29;
                if (local_2a0[0] != (QArrayData *)0x0) {
                  LOCK();
                  (local_2a0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_2a0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_2a0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_2a0[0],2,0x10);
                    ppQVar26 = ppQVar29;
                  }
                }
                ppQVar29 = ppQVar26;
                pQVar21 = (QMakeProject *)iVar14.i;
                if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                     )local_288.d.d !=
                    (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
                     )0x0) {
                  LOCK();
                  *(int *)local_288.d.d = *(int *)local_288.d.d + -1;
                  UNLOCK();
                  if (*(int *)local_288.d.d == 0) {
                    QArrayData::deallocate(&(local_288.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (local_268 != (undefined1  [8])0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d == 0) {
                    QArrayData::deallocate((QArrayData *)local_268,2,0x10);
                  }
                }
                pQVar9 = (QMakeProject *)
                         &(pQVar9->super_QMakeEvaluator).m_locationStack.
                          super_QList<QMakeEvaluator::Location>.d.size;
                lVar24 = lVar24 + -0x30;
              } while (lVar24 != 0);
            }
            QArrayDataPointer<ProString>::~QArrayDataPointer
                      ((QArrayDataPointer<ProString> *)local_2d8);
          }
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (local_e8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
            }
          }
        }
        if (local_108 != (ProFile *)0x0) {
          local_78 = (undefined1  [8])0x2b1f52;
          auStack_70._0_8_ = local_118;
          ::operator+=((QString *)&local_308,
                       (QStringBuilder<const_char_(&)[2],_QString_&> *)local_78);
        }
        if (local_148 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_148,2,0x10);
          }
        }
        if (local_118 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_118,2,0x10);
          }
        }
      }
    }
    local_268 = (undefined1  [8])0x0;
    pQStack_260 = (QMakeProject *)0x0;
    pQStack_258 = (QMakeProject *)0x0;
    bVar4 = ProString::operator==(iVar14.i,"C");
    if ((bVar4) || (bVar4 = ProString::operator==(iVar14.i,"OBJC"), bVar4)) {
      QVar57.m_size = (size_t)"$(CC)";
      QVar57.field_0.m_data = local_268;
      QString::assign(QVar57);
      uVar22 = 10;
      pcVar27 = " $(CFLAGS)";
    }
    else {
      QVar58.m_size = (size_t)"$(CXX)";
      QVar58.field_0.m_data = local_268;
      QString::assign(QVar58);
      uVar22 = 0xc;
      pcVar27 = " $(CXXFLAGS)";
    }
    QString::append(&local_308,pcVar27,uVar22);
    QString::append(&local_308," $(INCPATH)",0xb);
    PStack_98.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )&DAT_aaaaaaaaaaaaaaaa;
    local_90.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )&DAT_aaaaaaaaaaaaaaaa;
    pQStack_a0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pQStack_b0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
    ProString::ProString((ProString *)local_b8,iVar14.i);
    bVar4 = ProString::operator==((ProString *)local_b8,"C");
    if (bVar4) {
      ProString::ProString((ProString *)local_78,"CC");
      QString::operator=((QString *)local_b8,(QString *)local_78);
      auVar23 = local_78;
      local_90.d = (Data *)pQStack_50;
      pQStack_a0 = (QMakeProject *)auStack_70._16_8_;
      PStack_98.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
              )auStack_70._24_8_;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
    }
    local_c8.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )&DAT_aaaaaaaaaaaaaaaa;
    pQStack_c0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )&DAT_aaaaaaaaaaaaaaaa;
    uStack_d0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pQStack_e0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = (undefined1  [8])0x2aca61;
    auStack_70._0_8_ = (ProString *)local_b8;
    ProString::ProString<char_const(&)[11],ProString&>
              ((ProString *)local_e8,(QStringBuilder<const_char_(&)[11],_ProString_&> *)local_78);
    ppQVar26 = ppQVar29;
    bVar4 = QMakeProject::isEmpty(*ppQVar29,(ProKey *)local_e8);
    if (bVar4) {
      pUVar67 = pUVar68;
      pQVar12 = &QMakeEvaluator::valuesRef
                           (&((pUVar68->super_MakefileGenerator).project)->super_QMakeEvaluator,
                            (ProKey *)local_e8)->super_QList<ProString>;
      ProKey::ProKey((ProKey *)local_148,"QMAKE_CC_O_FLAG");
      (*(pUVar68->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16]
      )(local_2d8,pUVar68,(ProKey *)local_148);
      local_48 = (QMakeProject *)local_2c8;
      pQStack_50 = pQStack_2d0;
      auStack_70._24_8_ = local_2d8;
      local_2c8.ptr = (QMakeFeatureRoots *)0x0;
      local_78 = (undefined1  [8])local_268;
      auStack_70._0_8_ = " ";
      auStack_70._8_8_ = &local_308;
      auStack_70._16_8_ = " ";
      local_2d8 = (undefined1  [8])0x0;
      pQStack_2d0 = (QMakeProject *)0x0;
      local_40 = (QMakeParser *)0x2ae475;
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,char_const(&)[2]>,QString&>,char_const(&)[2]>,QString>,char_const(&)[10]>
                ((ProString *)local_118,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
                  *)local_78);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_118);
      QList<ProString>::end(pQVar12);
      ppQVar29 = ppQVar26;
      pUVar68 = pUVar67;
      if (local_118 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_118,2,0x10);
          ppQVar29 = ppQVar26;
          pUVar68 = pUVar67;
        }
      }
      if ((QMakeProject *)auStack_70._24_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_70._24_8_)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_70._24_8_)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auStack_70._24_8_)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)auStack_70._24_8_,2,0x10);
        }
      }
      ppQVar26 = ppQVar29;
      if (local_2d8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8,2,0x10);
        }
      }
      pQVar21 = (QMakeProject *)iVar14.i;
      if (local_148 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_148,2,0x10);
        }
      }
    }
    auStack_70._0_8_ = local_b8;
    local_f8.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )&DAT_aaaaaaaaaaaaaaaa;
    pLStack_f0 = (Location *)&DAT_aaaaaaaaaaaaaaaa;
    local_108 = (ProFile *)&DAT_aaaaaaaaaaaaaaaa;
    QStack_100.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_118 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pPStack_110 = (ProString *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = (undefined1  [8])0x2aca61;
    auStack_70._8_8_ = (long)"QMAKE_RUN_CC_IMP" + 0xc;
    ProString::ProString<QStringBuilder<char_const(&)[11],ProString&>,char_const(&)[5]>
              ((ProString *)local_118,
               (QStringBuilder<QStringBuilder<const_char_(&)[11],_ProString_&>,_const_char_(&)[5]> *
               )local_78);
    bVar4 = QMakeProject::isEmpty(*ppQVar29,(ProKey *)local_118);
    if (bVar4) {
      pUVar67 = pUVar68;
      pQVar12 = &QMakeEvaluator::valuesRef
                           (&((pUVar68->super_MakefileGenerator).project)->super_QMakeEvaluator,
                            (ProKey *)local_118)->super_QList<ProString>;
      ProKey::ProKey((ProKey *)local_2d8,"QMAKE_CC_O_FLAG");
      (*(pUVar68->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x16]
      )(&local_288,pUVar68,(ProKey *)local_2d8);
      local_48 = (QMakeProject *)local_288.d.size;
      pQStack_50 = (QMakeProject *)local_288.d.ptr;
      auStack_70._24_8_ = local_288.d.d;
      local_288.d.size = 0;
      local_78 = (undefined1  [8])local_268;
      auStack_70._0_8_ = " ";
      auStack_70._16_8_ = " ";
      local_288.d.d = (Data *)0x0;
      local_288.d.ptr = (char16_t *)0x0;
      local_40 = (QMakeParser *)0x2ae47f;
      auStack_70._8_8_ = &local_308;
      ProString::
      ProString<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString&,char_const(&)[2]>,QString&>,char_const(&)[2]>,QString>,char_const(&)[10]>
                ((ProString *)local_148,
                 (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_const_char_(&)[2]>,_QString_&>,_const_char_(&)[2]>,_QString>,_const_char_(&)[10]>
                  *)local_78);
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_148);
      QList<ProString>::end(pQVar12);
      pUVar68 = pUVar67;
      if (local_148 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_148,2,0x10);
          pUVar68 = pUVar67;
        }
      }
      uVar22 = auStack_70._24_8_;
      if ((QMakeProject *)auStack_70._24_8_ != (QMakeProject *)0x0) {
        LOCK();
        *(int *)&(((QString *)&((QMakeEvaluator *)auStack_70._24_8_)->m_caller)->d).d =
             *(int *)&(((QString *)&((QMakeEvaluator *)auStack_70._24_8_)->m_caller)->d).d + -1;
        UNLOCK();
        if (*(int *)&(((QString *)&((QMakeEvaluator *)uVar22)->m_caller)->d).d == 0) {
          QArrayData::deallocate((QArrayData *)auStack_70._24_8_,2,0x10);
        }
      }
      if ((totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
           )local_288.d.d !=
          (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
           )0x0) {
        LOCK();
        *(int *)local_288.d.d = *(int *)local_288.d.d + -1;
        UNLOCK();
        if (*(int *)local_288.d.d == 0) {
          QArrayData::deallocate(&(local_288.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_2d8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_2d8,2,0x10);
        }
      }
    }
    if (local_118 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_118,2,0x10);
      }
    }
    if (local_e8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_e8,2,0x10);
      }
    }
    if (local_b8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
    if (local_268 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_268)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_268,2,0x10);
      }
    }
    if ((QMakeProject *)local_308.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
      LOCK();
      *(int *)&((DataPointer *)
               &((QMakeEvaluator *)&(local_308.super_ProString.m_string.d.d)->super_QArrayData)->
                m_caller)->d =
           *(int *)&((DataPointer *)
                    &((QMakeEvaluator *)&(local_308.super_ProString.m_string.d.d)->super_QArrayData)
                     ->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)
                   &((QMakeEvaluator *)&(local_308.super_ProString.m_string.d.d)->super_QArrayData)
                    ->m_caller)->d == 0) {
        QArrayData::deallocate(&(local_308.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    ppQVar29 = ppQVar26;
  }
  pQVar9 = *ppQVar29;
  QVar59.m_data = (storage_type *)0x3;
  QVar59.m_size = (qsizetype)local_78;
  QString::fromUtf8(QVar59);
  auVar23 = local_78;
  bVar5 = false;
  config_10.m_data = (storage_type_conflict *)auStack_70._0_8_;
  config_10.m_size = auStack_70._8_8_;
  bVar4 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_10,false);
  ppQVar26 = ppQVar29;
  if (bVar4) {
    pQVar9 = *ppQVar29;
    ProKey::ProKey((ProKey *)local_78,"TARGET");
    bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
    if (bVar4) {
      bVar5 = false;
    }
    else {
      pQVar9 = *ppQVar29;
      QVar60.m_data = (storage_type *)0xa;
      QVar60.m_size = (qsizetype)local_b8;
      QString::fromUtf8(QVar60);
      auVar30 = local_b8;
      config_11.m_data = (storage_type_conflict *)pQStack_b0;
      config_11.m_size = (qsizetype)local_a8.d.ptr;
      bVar4 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_11,false);
      bVar5 = true;
      if (!bVar4) {
        pQVar9 = *ppQVar26;
        ProKey::ProKey((ProKey *)local_b8,"BUILDS");
        bVar5 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_b8);
        auVar3 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar3)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
      }
      if (auVar30 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)auVar30,2,0x10);
        }
      }
    }
    auVar30 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
  }
  if (auVar23 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
    }
  }
  if (bVar5 == false) {
    pQVar9 = *ppQVar26;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE");
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)->
               super_QList<ProString>;
    QList<ProString>::clear(pQVar12);
    auVar23 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)local_78,2,0x10);
      }
    }
    pQVar9 = *ppQVar26;
    ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
    pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)->
               super_QList<ProString>;
    QList<ProString>::clear(pQVar12);
    auVar23 = local_78;
    if (local_78 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
      iVar8 = *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d;
      UNLOCK();
      auVar23 = local_78;
      goto joined_r0x001a8df5;
    }
  }
  else {
    local_c8.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )&DAT_aaaaaaaaaaaaaaaa;
    pQStack_c0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
    local_d8.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
          )&DAT_aaaaaaaaaaaaaaaa;
    uStack_d0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    pQStack_e0 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
    ProString::ProString((ProString *)local_e8);
    pQVar9 = *ppQVar26;
    QVar61.m_data = (storage_type *)0x6;
    QVar61.m_size = (qsizetype)local_78;
    QString::fromUtf8(QVar61);
    auVar23 = local_78;
    bVar4 = false;
    config_12.m_data = (storage_type_conflict *)auStack_70._0_8_;
    config_12.m_size = auStack_70._8_8_;
    bVar5 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_12,false);
    if (bVar5) {
      pQVar9 = *ppQVar26;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_EXTENSION");
      bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
      auVar30 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar30)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      bVar4 = !bVar4;
    }
    if (auVar23 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
      UNLOCK();
      if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
        QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
      }
    }
    if (bVar4) {
      pQVar9 = *ppQVar26;
      ProKey::ProKey((ProKey *)local_b8,"TARGET");
      QMakeEvaluator::first((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
      QString::operator=((QString *)local_e8,(QString *)local_78);
      auVar23 = local_78;
      uStack_d0 = (QMakeProject *)auStack_70._16_8_;
      local_c8.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
              )auStack_70._24_8_;
      pQStack_c0 = pQStack_50;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      auVar23 = local_b8;
      if (local_b8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
        }
      }
      pQVar9 = *ppQVar26;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_NAME");
      bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
      auVar23 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      if (!bVar4) {
        pQVar9 = *ppQVar26;
        ProKey::ProKey((ProKey *)local_b8,"QMAKE_BUNDLE_NAME");
        QMakeEvaluator::first
                  ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
        QString::operator=((QString *)local_e8,(QString *)local_78);
        auVar23 = local_78;
        pQStack_c0 = pQStack_50;
        uStack_d0 = (QMakeProject *)auStack_70._16_8_;
        local_c8.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
              )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                )auStack_70._24_8_;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        auVar23 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
          iVar8 = *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d;
          UNLOCK();
          auVar23 = local_b8;
joined_r0x001a9ccd:
          if (iVar8 == 0) {
            QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
          }
        }
      }
LAB_001a9cdc:
      pQVar9 = *ppQVar26;
      ProKey::ProKey((ProKey *)local_b8,"QMAKE_BUNDLE_EXTENSION");
      QMakeEvaluator::first((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
      bVar4 = ProString::endsWith((ProString *)local_e8,(ProString *)local_78,CaseSensitive);
      auVar23 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      auVar23 = local_b8;
      if (local_b8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
        }
      }
      if (!bVar4) {
        pQVar9 = *ppQVar26;
        ProKey::ProKey((ProKey *)local_b8,"QMAKE_BUNDLE_EXTENSION");
        QMakeEvaluator::first
                  ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
        ProString::append((ProString *)local_e8,(ProString *)local_78,(bool *)0x0);
        auVar23 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        auVar23 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
          iVar8 = *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d;
          UNLOCK();
          auVar23 = local_b8;
joined_r0x001a9af2:
          if (iVar8 == 0) {
            QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
          }
        }
      }
    }
    else {
      pQVar9 = *ppQVar26;
      ppQVar29 = ppQVar26;
      ProKey::ProKey((ProKey *)local_b8,"TEMPLATE");
      QMakeEvaluator::first((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
      bVar4 = ProString::operator==((ProString *)local_78,"app");
      if (bVar4) {
        pQVar9 = *ppQVar26;
        QVar62.m_data = (storage_type *)0xa;
        QVar62.m_size = (qsizetype)local_118;
        QString::fromUtf8(QVar62);
        auVar23 = local_118;
        config_13.m_data = (storage_type_conflict *)pPStack_110;
        config_13.m_size = (qsizetype)local_108;
        bVar4 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_13,false);
        if (auVar23 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
          }
        }
      }
      else {
        bVar4 = false;
      }
      auVar23 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      auVar23 = local_b8;
      if (local_b8 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
        }
      }
      if (bVar4 == false) {
        pQVar9 = *ppQVar26;
        ProKey::ProKey((ProKey *)local_b8,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
        bVar4 = ProString::operator==((ProString *)local_78,"lib");
        if (bVar4) {
          pQVar9 = *ppQVar26;
          QVar63.m_data = (storage_type *)0x9;
          QVar63.m_size = (qsizetype)local_118;
          QString::fromUtf8(QVar63);
          auVar23 = local_118;
          bVar4 = false;
          config_14.m_data = (storage_type_conflict *)pPStack_110;
          config_14.m_size = (qsizetype)local_108;
          bVar5 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_14,false);
          if (!bVar5) {
            pQVar9 = *ppQVar29;
            QVar64.m_data = (storage_type *)0x6;
            QVar64.m_size = (qsizetype)local_118;
            QString::fromUtf8(QVar64);
            auVar30 = local_118;
            config_15.m_data = (storage_type_conflict *)pPStack_110;
            config_15.m_size = (qsizetype)local_108;
            bVar5 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_15,false);
            if (bVar5) {
LAB_001a9479:
              pQVar9 = *ppQVar29;
              QVar65.m_data = (storage_type *)0x6;
              QVar65.m_size = (qsizetype)local_118;
              QString::fromUtf8(QVar65);
              auVar3 = local_118;
              bVar4 = false;
              config_17.m_data = (storage_type_conflict *)pPStack_110;
              config_17.m_size = (qsizetype)local_108;
              bVar6 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_17,false);
              if (bVar6) {
                pQVar9 = *ppQVar29;
                QString::QString((QString *)local_118,"plugin_bundle");
                config_18.m_data = (storage_type_conflict *)pPStack_110;
                config_18.m_size = (qsizetype)local_108;
                bVar4 = QMakeEvaluator::isActiveConfig
                                  (&pQVar9->super_QMakeEvaluator,config_18,false);
                if (local_118 != (undefined1  [8])0x0) {
                  LOCK();
                  *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d =
                       *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d + -1;
                  UNLOCK();
                  if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d == 0) {
                    QArrayData::deallocate((QArrayData *)local_118,2,0x10);
                  }
                }
              }
              if (auVar3 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar3)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar3)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar3)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)auVar3,2,0x10);
                }
              }
              if (!bVar5) goto LAB_001a953b;
            }
            else {
              pQVar9 = *ppQVar29;
              QString::QString((QString *)local_148,"lib_bundle");
              config_16.m_data = (storage_type_conflict *)pQStack_140;
              config_16.m_size = (qsizetype)local_138.d.ptr;
              bVar6 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_16,false);
              bVar4 = true;
              if (!bVar6) goto LAB_001a9479;
LAB_001a953b:
              if (local_148 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_148,2,0x10);
                }
              }
            }
            if (auVar30 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&(((QMakeProject *)auVar30)->super_QMakeEvaluator).m_caller)
                       ->d = *(int *)&((DataPointer *)
                                      &(((QMakeProject *)auVar30)->super_QMakeEvaluator).m_caller)->
                                      d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)
                           &(((QMakeProject *)auVar30)->super_QMakeEvaluator).m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)auVar30,2,0x10);
              }
            }
          }
          if (auVar23 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
            }
          }
        }
        else {
          bVar4 = false;
        }
        auVar23 = local_78;
        ppQVar26 = ppQVar29;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            ppQVar26 = ppQVar29;
          }
        }
        auVar23 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        if (bVar4 != false) {
          pQVar9 = *ppQVar26;
          ppQVar29 = ppQVar26;
          ProKey::ProKey((ProKey *)local_b8,"TARGET");
          QMakeEvaluator::first
                    ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
          QString::operator=((QString *)local_e8,(QString *)local_78);
          auVar23 = local_78;
          uStack_d0 = (QMakeProject *)auStack_70._16_8_;
          local_c8.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                  )auStack_70._24_8_;
          pQStack_c0 = pQStack_50;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          auVar23 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          pQVar9 = *ppQVar26;
          QVar66.m_data = (storage_type *)0x6;
          QVar66.m_size = (qsizetype)local_78;
          QString::fromUtf8(QVar66);
          auVar23 = local_78;
          config_19.m_data = (storage_type_conflict *)auStack_70._0_8_;
          config_19.m_size = auStack_70._8_8_;
          bVar4 = QMakeEvaluator::isActiveConfig(&pQVar9->super_QMakeEvaluator,config_19,false);
          ppQVar26 = ppQVar29;
          if (auVar23 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
              ppQVar26 = ppQVar29;
            }
          }
          pQVar9 = *ppQVar26;
          if (!bVar4) {
            ProKey::ProKey((ProKey *)local_78,"QMAKE_FRAMEWORK_BUNDLE_NAME");
            bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
            auVar23 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            if (!bVar4) {
              pQVar9 = *ppQVar26;
              ProKey::ProKey((ProKey *)local_b8,"QMAKE_FRAMEWORK_BUNDLE_NAME");
              QMakeEvaluator::first
                        ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
              QString::operator=((QString *)local_e8,(QString *)local_78);
              auVar23 = local_78;
              pQStack_c0 = pQStack_50;
              uStack_d0 = (QMakeProject *)auStack_70._16_8_;
              local_c8.d.d.ptr =
                   (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                    )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                      )auStack_70._24_8_;
              if (local_78 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_78,2,0x10);
                }
              }
              auVar23 = local_b8;
              if (local_b8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                }
              }
            }
            pQVar9 = *ppQVar26;
            ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_EXTENSION");
            bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
            auVar23 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            if (bVar4) {
              pQVar9 = *ppQVar26;
              ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_EXTENSION");
              pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)
                         ->super_QList<ProString>;
              ProString::ProString((ProString *)local_b8,".framework");
              QList<ProString>::append(pQVar12,(ProString *)local_b8);
              auVar23 = local_b8;
              if (local_b8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
                UNLOCK();
                if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                  QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
                }
              }
              auVar23 = local_78;
              if (local_78 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                     *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
                iVar8 = *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d;
                UNLOCK();
                auVar23 = local_78;
                goto joined_r0x001a9ccd;
              }
            }
            goto LAB_001a9cdc;
          }
          ProKey::ProKey((ProKey *)local_78,"QMAKE_PLUGIN_BUNDLE_NAME");
          bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
          auVar23 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (!bVar4) {
            pQVar9 = *ppQVar26;
            ProKey::ProKey((ProKey *)local_b8,"QMAKE_PLUGIN_BUNDLE_NAME");
            QMakeEvaluator::first
                      ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
            QString::operator=((QString *)local_e8,(QString *)local_78);
            auVar23 = local_78;
            pQStack_c0 = pQStack_50;
            uStack_d0 = (QMakeProject *)auStack_70._16_8_;
            local_c8.d.d.ptr =
                 (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                  )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                    )auStack_70._24_8_;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            auVar23 = local_b8;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
          }
          pQVar9 = *ppQVar26;
          ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_EXTENSION");
          bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
          auVar23 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (bVar4) {
            pQVar9 = *ppQVar26;
            ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_EXTENSION");
            pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)->
                       super_QList<ProString>;
            ProString::ProString((ProString *)local_b8,".plugin");
            QList<ProString>::append(pQVar12,(ProString *)local_b8);
            auVar23 = local_b8;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
            auVar23 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
          }
          pQVar9 = *ppQVar26;
          ProKey::ProKey((ProKey *)local_b8,"QMAKE_BUNDLE_EXTENSION");
          QMakeEvaluator::first
                    ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
          bVar4 = ProString::endsWith((ProString *)local_e8,(ProString *)local_78,CaseSensitive);
          auVar23 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          auVar23 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          if (!bVar4) {
            pQVar9 = *ppQVar26;
            ProKey::ProKey((ProKey *)local_b8,"QMAKE_BUNDLE_EXTENSION");
            QMakeEvaluator::first
                      ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
            ProString::append((ProString *)local_e8,(ProString *)local_78,(bool *)0x0);
            auVar23 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_78,2,0x10);
              }
            }
            auVar23 = local_b8;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
          }
          pQVar9 = *ppQVar26;
          ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
          bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
          auVar23 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          if (bVar4) {
            pQVar9 = *ppQVar26;
            ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
            pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)->
                       super_QList<ProString>;
            ProString::ProString((ProString *)local_b8,"Contents/MacOS");
            QList<ProString>::append(pQVar12,(ProString *)local_b8);
            auVar23 = local_b8;
            if (local_b8 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
                QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
              }
            }
            auVar23 = local_78;
            if (local_78 != (undefined1  [8])0x0) {
              LOCK();
              *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                   *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
              iVar8 = *(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d;
              UNLOCK();
              auVar23 = local_78;
              goto joined_r0x001a9af2;
            }
          }
        }
      }
      else {
        pQVar9 = *ppQVar26;
        ProKey::ProKey((ProKey *)local_b8,"TARGET");
        QMakeEvaluator::first
                  ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
        QString::operator=((QString *)local_e8,(QString *)local_78);
        auVar23 = local_78;
        uStack_d0 = (QMakeProject *)auStack_70._16_8_;
        local_c8.d.d.ptr =
             (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
              )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                )auStack_70._24_8_;
        pQStack_c0 = pQStack_50;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        auVar23 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        pQVar9 = *ppQVar26;
        ProKey::ProKey((ProKey *)local_78,"QMAKE_APPLICATION_BUNDLE_NAME");
        bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
        auVar23 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        if (!bVar4) {
          pQVar9 = *ppQVar26;
          ProKey::ProKey((ProKey *)local_b8,"QMAKE_APPLICATION_BUNDLE_NAME");
          QMakeEvaluator::first
                    ((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
          QString::operator=((QString *)local_e8,(QString *)local_78);
          auVar23 = local_78;
          pQStack_c0 = pQStack_50;
          uStack_d0 = (QMakeProject *)auStack_70._16_8_;
          local_c8.d.d.ptr =
               (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                )(QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
                  )auStack_70._24_8_;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
          auVar23 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
        }
        bVar4 = ProString::endsWith((ProString *)local_e8,".app",CaseSensitive);
        if (!bVar4) {
          other.m_data = ".app";
          other.m_size = 4;
          ProString::append((ProString *)local_e8,other);
        }
        pQVar9 = *ppQVar26;
        ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
        bVar4 = QMakeProject::isEmpty(pQVar9,(ProKey *)local_78);
        auVar23 = local_78;
        ppQVar26 = ppQVar29;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            ppQVar26 = ppQVar29;
          }
        }
        if (bVar4) {
          pQVar9 = *ppQVar26;
          ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
          pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)->
                     super_QList<ProString>;
          ProString::ProString((ProString *)local_b8,"Contents/MacOS");
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                    ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_b8)
          ;
          QList<ProString>::end(pQVar12);
          auVar23 = local_b8;
          if (local_b8 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          auVar23 = local_78;
          if (local_78 != (undefined1  [8])0x0) {
            LOCK();
            *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
                 *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
            UNLOCK();
            if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
              QArrayData::deallocate((QArrayData *)local_78,2,0x10);
            }
          }
        }
        pQVar9 = *ppQVar26;
        ProKey::ProKey((ProKey *)local_118,"QMAKE_PKGINFO");
        pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_118)->
                   super_QList<ProString>;
        pQVar9 = *ppQVar26;
        ProKey::ProKey(&local_308,"DESTDIR");
        QMakeEvaluator::first((ProString *)local_2d8,&pQVar9->super_QMakeEvaluator,&local_308);
        ProString::ProString((ProString *)local_b8,(ProString *)local_2d8);
        local_88.d = (Data *)local_e8;
        ProString::ProString((ProString *)local_78,(ProString *)local_b8);
        local_48 = (QMakeProject *)local_88.d;
        local_40 = (QMakeParser *)0x2ae4bc;
        ProString::ProString<QStringBuilder<ProString,ProString&>,char_const(&)[18]>
                  ((ProString *)local_148,
                   (QStringBuilder<QStringBuilder<ProString,_ProString_&>,_const_char_(&)[18]> *)
                   local_78);
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString>
                  ((QMovableArrayOps<ProString> *)pQVar12,(pQVar12->d).size,(ProString *)local_148);
        QList<ProString>::end(pQVar12);
        if (local_148 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_148)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_148,2,0x10);
          }
        }
        auVar23 = local_78;
        if (local_78 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
        auVar23 = local_b8;
        if (local_b8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
          }
        }
        if (local_2d8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_2d8)->m_caller)->d == 0) {
            QArrayData::deallocate((QArrayData *)local_2d8,2,0x10);
          }
        }
        if ((QMakeProject *)local_308.super_ProString.m_string.d.d != (QMakeProject *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)
                   &((QMakeEvaluator *)&(local_308.super_ProString.m_string.d.d)->super_QArrayData)
                    ->m_caller)->d =
               *(int *)&((DataPointer *)
                        &((QMakeEvaluator *)
                         &(local_308.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
               + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)
                       &((QMakeEvaluator *)
                        &(local_308.super_ProString.m_string.d.d)->super_QArrayData)->m_caller)->d
              == 0) {
            QArrayData::deallocate
                      (&(local_308.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (local_118 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d =
               *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d + -1;
          iVar8 = *(int *)&((DataPointer *)&((QMakeEvaluator *)local_118)->m_caller)->d;
          UNLOCK();
          auVar23 = local_118;
          goto joined_r0x001a9af2;
        }
      }
    }
    if (uStack_d0._4_4_ == 0) {
      pQVar9 = *ppQVar26;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE");
      pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)->
                 super_QList<ProString>;
      QList<ProString>::clear(pQVar12);
      auVar23 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      pQVar9 = *ppQVar26;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE_LOCATION");
      pQVar12 = &QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78)->
                 super_QList<ProString>;
      QList<ProString>::clear(pQVar12);
      auVar23 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
    }
    else {
      local_118 = (undefined1  [8])0x0;
      pPStack_110 = (ProString *)0x0;
      local_108 = (ProFile *)0x0;
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)local_118,0,(ProString *)local_e8);
      QList<ProString>::end((QList<ProString> *)local_118);
      pQVar9 = *ppQVar26;
      ProKey::ProKey((ProKey *)local_78,"QMAKE_BUNDLE");
      pPVar18 = QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_78);
      pPVar25 = local_108;
      pPVar1 = pPStack_110;
      auVar23 = local_118;
      local_108 = (ProFile *)0x0;
      local_118 = (undefined1  [8])0x0;
      pPStack_110 = (ProString *)0x0;
      local_b8 = (undefined1  [8])(pPVar18->super_QList<ProString>).d.d;
      pQStack_b0 = (QMakeProject *)(pPVar18->super_QList<ProString>).d.ptr;
      (pPVar18->super_QList<ProString>).d.d = (Data *)auVar23;
      (pPVar18->super_QList<ProString>).d.ptr = pPVar1;
      local_a8.d.ptr =
           (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
            )(pPVar18->super_QList<ProString>).d.size;
      (pPVar18->super_QList<ProString>).d.size = (qsizetype)pPVar25;
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_b8);
      auVar23 = local_78;
      if (local_78 != (undefined1  [8])0x0) {
        LOCK();
        *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
             *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
        UNLOCK();
        if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
          QArrayData::deallocate((QArrayData *)local_78,2,0x10);
        }
      }
      QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)local_118);
    }
    if (local_e8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d =
           *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d + -1;
      iVar8 = *(int *)&((DataPointer *)&((QMakeEvaluator *)local_e8)->m_caller)->d;
      UNLOCK();
      auVar23 = local_e8;
joined_r0x001a8df5:
      if (iVar8 == 0) {
        QArrayData::deallocate((QArrayData *)auVar23,2,0x10);
      }
    }
  }
  init2(pUVar68);
  auStack_70._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QMakeProject *)&DAT_aaaaaaaaaaaaaaaa;
  auStack_70._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  auStack_70._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  auStack_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar9 = (pUVar68->super_MakefileGenerator).project;
  ProKey::ProKey((ProKey *)local_b8,"TARGET");
  QMakeEvaluator::first((ProString *)local_78,&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
  auVar23 = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  iVar8 = ProString::lastIndexOf((ProString *)local_78,&Option::dir_sep,-1,CaseSensitive);
  if (iVar8 != -1) {
    auStack_70._20_4_ = auStack_70._20_4_ - (iVar8 + 1);
    auStack_70._16_4_ = auStack_70._16_4_ + iVar8 + 1;
  }
  pQVar9 = *ppQVar26;
  ProKey::ProKey((ProKey *)local_b8,"LIB_TARGET");
  this_01 = (QMovableArrayOps<ProString> *)
            QMakeEvaluator::valuesRef(&pQVar9->super_QMakeEvaluator,(ProKey *)local_b8);
  QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>(this_01,0,(ProString *)local_78)
  ;
  auVar23 = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_b8)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)auVar23)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
    }
  }
  if (local_78 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d =
         *(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d + -1;
    UNLOCK();
    if (*(int *)&((DataPointer *)&((QMakeEvaluator *)local_78)->m_caller)->d == 0) {
      QArrayData::deallocate((QArrayData *)local_78,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_218);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1f8);
LAB_001aa042:
  if (&(local_1d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_1d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_1d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_1b8);
  if (*(QMakeHandler **)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(QMakeHandler **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void
UnixMakefileGenerator::init()
{
    ProStringList &configs = project->values("CONFIG");
    if(project->isEmpty("ICON") && !project->isEmpty("RC_FILE"))
        project->values("ICON") = project->values("RC_FILE");
    if(project->isEmpty("QMAKE_EXTENSION_PLUGIN"))
        project->values("QMAKE_EXTENSION_PLUGIN").append(project->first("QMAKE_EXTENSION_SHLIB"));

    project->values("QMAKE_ORIG_TARGET") = project->values("TARGET");

    //version handling
    if (project->isEmpty("VERSION")) {
        project->values("VERSION").append(
            "1.0." + (project->isEmpty("VER_PAT") ? QString("0") : project->first("VER_PAT")));
    }
    QStringList l = project->first("VERSION").toQString().split('.');
    l << "0" << "0"; //make sure there are three
    project->values("VER_MAJ").append(l[0]);
    project->values("VER_MIN").append(l[1]);
    project->values("VER_PAT").append(l[2]);

    QString sroot = project->sourceRoot();
    for (const ProString &iif : project->values("QMAKE_INTERNAL_INCLUDED_FILES")) {
        if (iif == project->cacheFile())
            continue;
        if (iif.startsWith(sroot) && iif.at(sroot.size()) == QLatin1Char('/'))
            project->values("DISTFILES") += fileFixify(iif.toQString(), FileFixifyRelative);
    }

    /* this should probably not be here, but I'm using it to wrap the .t files */
    if(project->first("TEMPLATE") == "app")
        project->values("QMAKE_APP_FLAG").append("1");
    else if(project->first("TEMPLATE") == "lib")
        project->values("QMAKE_LIB_FLAG").append("1");
    else if(project->first("TEMPLATE") == "subdirs") {
        MakefileGenerator::init();
        if(project->isEmpty("MAKEFILE"))
            project->values("MAKEFILE").append("Makefile");
        return; /* subdirs is done */
    }

    project->values("QMAKE_ORIG_DESTDIR") = project->values("DESTDIR");
    if((!project->isEmpty("QMAKE_LIB_FLAG") && !project->isActiveConfig("staticlib")) ||
       (project->isActiveConfig("qt") &&  project->isActiveConfig("plugin"))) {
        if(configs.indexOf("dll") == -1) configs.append("dll");
    } else if(!project->isEmpty("QMAKE_APP_FLAG") || project->isActiveConfig("dll")) {
        configs.removeAll("staticlib");
    }
    if(!project->isEmpty("QMAKE_INCREMENTAL"))
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_INCREMENTAL");
    else if(!project->isEmpty("QMAKE_LFLAGS_PREBIND") &&
            !project->values("QMAKE_LIB_FLAG").isEmpty() &&
            project->isActiveConfig("dll"))
        project->values("QMAKE_LFLAGS") += project->values("QMAKE_LFLAGS_PREBIND");
    project->values("QMAKE_INCDIR") += project->values("QMAKE_INCDIR_POST");
    project->values("QMAKE_RPATHDIR") += project->values("QMAKE_RPATHDIR_POST");
    project->values("QMAKE_RPATHLINKDIR") += project->values("QMAKE_RPATHLINKDIR_POST");
    if(!project->isEmpty("QMAKE_INCDIR"))
        project->values("INCLUDEPATH") += project->values("QMAKE_INCDIR");
    // The order of the next two lines is relevant due to side effect on QMAKE_LFLAGS.
    ProStringList ldadd = project->values("QMAKE_LIBDIR_FLAGS") + libdirToFlags("QMAKE_LIBDIR");
    ProStringList ldaddpost = libdirToFlags("QMAKE_LIBDIR_POST");
    if (project->isActiveConfig("mac")) {
        if (!project->isEmpty("QMAKE_FRAMEWORKPATH")) {
            const ProStringList &fwdirs = project->values("QMAKE_FRAMEWORKPATH");
            for (int i = 0; i < fwdirs.size(); ++i)
                project->values("QMAKE_FRAMEWORKPATH_FLAGS") += "-F" + escapeFilePath(fwdirs[i]);
        }
        ldadd += project->values("QMAKE_FRAMEWORKPATH_FLAGS");
    }
    ProStringList &qmklibs = project->values("LIBS");
    qmklibs = ldadd + qmklibs;
    ProStringList &qmklibspost = project->values("QMAKE_LIBS");
    qmklibspost = ldaddpost + qmklibspost;
    if (!project->isEmpty("QMAKE_RPATHDIR") && !project->isEmpty("QMAKE_LFLAGS_RPATH")) {
        const ProStringList &rpathdirs = project->values("QMAKE_RPATHDIR");
        for (int i = 0; i < rpathdirs.size(); ++i) {
            QString rpathdir = rpathdirs[i].toQString();
            if (rpathdir.size() > 1 && rpathdir.at(0) == '$' && rpathdir.at(1) != '(') {
                rpathdir.replace(0, 1, "\\$$");  // Escape from make and the shell
            } else if (!rpathdir.startsWith('@') && fileInfo(rpathdir).isRelative()) {
                QString rpathbase = project->first("QMAKE_REL_RPATH_BASE").toQString();
                if (rpathbase.isEmpty()) {
                    fprintf(stderr, "Error: This platform does not support relative paths in QMAKE_RPATHDIR (%s)\n",
                                    rpathdir.toLatin1().constData());
                    continue;
                }
                if (rpathbase.startsWith('$'))
                    rpathbase.replace(0, 1, "\\$$");  // Escape from make and the shell
                if (rpathdir == ".")
                    rpathdir = rpathbase;
                else
                    rpathdir.prepend(rpathbase + '/');
                project->values("QMAKE_LFLAGS").insertUnique(project->values("QMAKE_LFLAGS_REL_RPATH"));
            }
            project->values("QMAKE_LFLAGS") += var("QMAKE_LFLAGS_RPATH") + escapeFilePath(rpathdir);
        }
    }
    if (!project->isEmpty("QMAKE_RPATHLINKDIR")) {
        const ProStringList &rpathdirs = project->values("QMAKE_RPATHLINKDIR");
        for (int i = 0; i < rpathdirs.size(); ++i) {
            if (!project->isEmpty("QMAKE_LFLAGS_RPATHLINK"))
                project->values("QMAKE_LFLAGS") += var("QMAKE_LFLAGS_RPATHLINK") + escapeFilePath(QFileInfo(rpathdirs[i].toQString()).absoluteFilePath());
        }
    }

    if(project->isActiveConfig("GNUmake") && !project->isEmpty("QMAKE_CFLAGS_DEPS"))
        include_deps = true; //do not generate deps

    MakefileGenerator::init();

    if (project->isActiveConfig("objective_c"))
        project->values("QMAKE_BUILTIN_COMPILERS") << "OBJC" << "OBJCXX";

    for (const ProString &compiler : project->values("QMAKE_BUILTIN_COMPILERS")) {
        QString compile_flag = var("QMAKE_COMPILE_FLAG");
        if(compile_flag.isEmpty())
            compile_flag = "-c";

        if(doPrecompiledHeaders() && !project->isEmpty("PRECOMPILED_HEADER")) {
            QString pchFlags = var(ProKey("QMAKE_" + compiler + "FLAGS_USE_PRECOMPILE"));

            QString pchBaseName;
            if(!project->isEmpty("PRECOMPILED_DIR")) {
                pchBaseName = Option::fixPathToTargetOS(project->first("PRECOMPILED_DIR").toQString());
                if(!pchBaseName.endsWith(Option::dir_sep))
                    pchBaseName += Option::dir_sep;
            }
            pchBaseName += project->first("QMAKE_ORIG_TARGET").toQString();

            // replace place holders
            pchFlags.replace(QLatin1String("${QMAKE_PCH_INPUT}"),
                             escapeFilePath(project->first("PRECOMPILED_HEADER").toQString()));
            pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_BASE}"), escapeFilePath(pchBaseName));
            if (project->isActiveConfig("icc_pch_style")) {
                // icc style
                pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT}"),
                                 escapeFilePath(pchBaseName + project->first("QMAKE_PCH_OUTPUT_EXT")));
                const ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                for (const ProString &arch : pchArchs) {
                    QString suffix = project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
                    suffix.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                    pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_") + arch + QLatin1Char('}'),
                                     escapeFilePath(pchBaseName + suffix));
                }
            } else {
                // gcc style (including clang_pch_style)
                QString headerSuffix;
                if (project->isActiveConfig("clang_pch_style"))
                    headerSuffix = project->first("QMAKE_PCH_OUTPUT_EXT").toQString();

                pchBaseName += project->first("QMAKE_PCH_OUTPUT_EXT").toQString();
                pchBaseName += Option::dir_sep;

                ProString language = project->first(ProKey("QMAKE_LANGUAGE_" + compiler));
                if (!language.isEmpty()) {
                    pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT}"),
                                     escapeFilePath(pchBaseName + language + headerSuffix));
                    const ProStringList pchArchs = project->values("QMAKE_PCH_ARCHS");
                    for (const ProString &arch : pchArchs) {
                        QString file = pchBaseName + language + headerSuffix;
                        file.replace(QLatin1String("${QMAKE_PCH_ARCH}"), arch.toQString());
                        if (project->isActiveConfig("clang_pch_style")
                            && (file.endsWith(QLatin1String(".pch"))
                                || file.endsWith(QLatin1String(".gch")))) {
                            file.chop(4); // must omit header suffix for -include to recognize the PCH
                        }
                        pchFlags.replace(QLatin1String("${QMAKE_PCH_OUTPUT_") + arch + QLatin1Char('}'),
                                         escapeFilePath(file));
                    }
                }
            }

            if (!pchFlags.isEmpty())
                compile_flag += " " + pchFlags;
        }

        QString compilerExecutable;
        if (compiler == "C" || compiler == "OBJC") {
            compilerExecutable = "$(CC)";
            compile_flag += " $(CFLAGS)";
        } else {
            compilerExecutable = "$(CXX)";
            compile_flag += " $(CXXFLAGS)";
        }

        compile_flag += " $(INCPATH)";

        ProString compilerVariable = compiler;
        if (compilerVariable == "C")
            compilerVariable = ProString("CC");

        const ProKey runComp("QMAKE_RUN_" + compilerVariable);
        if(project->isEmpty(runComp))
            project->values(runComp).append(compilerExecutable + " " + compile_flag + " " + var("QMAKE_CC_O_FLAG") + "$obj $src");
        const ProKey runCompImp("QMAKE_RUN_" + compilerVariable + "_IMP");
        if(project->isEmpty(runCompImp))
            project->values(runCompImp).append(compilerExecutable + " " + compile_flag + " " + var("QMAKE_CC_O_FLAG") + "\"$@\" \"$<\"");
    }

    if (project->isActiveConfig("mac") && !project->isEmpty("TARGET") &&
       ((project->isActiveConfig("build_pass") || project->isEmpty("BUILDS")))) {
        ProString bundle;
        if(project->isActiveConfig("bundle") && !project->isEmpty("QMAKE_BUNDLE_EXTENSION")) {
            bundle = project->first("TARGET");
            if(!project->isEmpty("QMAKE_BUNDLE_NAME"))
                bundle = project->first("QMAKE_BUNDLE_NAME");
            if(!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                bundle += project->first("QMAKE_BUNDLE_EXTENSION");
        } else if(project->first("TEMPLATE") == "app" && project->isActiveConfig("app_bundle")) {
            bundle = project->first("TARGET");
            if(!project->isEmpty("QMAKE_APPLICATION_BUNDLE_NAME"))
                bundle = project->first("QMAKE_APPLICATION_BUNDLE_NAME");
            if(!bundle.endsWith(".app"))
                bundle += ".app";
            if(project->isEmpty("QMAKE_BUNDLE_LOCATION"))
                project->values("QMAKE_BUNDLE_LOCATION").append("Contents/MacOS");
            project->values("QMAKE_PKGINFO").append(project->first("DESTDIR") + bundle + "/Contents/PkgInfo");
        } else if(project->first("TEMPLATE") == "lib" && !project->isActiveConfig("staticlib") &&
                  ((!project->isActiveConfig("plugin") && project->isActiveConfig("lib_bundle")) ||
                   (project->isActiveConfig("plugin") && project->isActiveConfig("plugin_bundle")))) {
            bundle = project->first("TARGET");
            if(project->isActiveConfig("plugin")) {
                if(!project->isEmpty("QMAKE_PLUGIN_BUNDLE_NAME"))
                    bundle = project->first("QMAKE_PLUGIN_BUNDLE_NAME");
                if (project->isEmpty("QMAKE_BUNDLE_EXTENSION"))
                    project->values("QMAKE_BUNDLE_EXTENSION").append(".plugin");
                if (!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                    bundle += project->first("QMAKE_BUNDLE_EXTENSION");
                if(project->isEmpty("QMAKE_BUNDLE_LOCATION"))
                    project->values("QMAKE_BUNDLE_LOCATION").append("Contents/MacOS");
            } else {
                if(!project->isEmpty("QMAKE_FRAMEWORK_BUNDLE_NAME"))
                    bundle = project->first("QMAKE_FRAMEWORK_BUNDLE_NAME");
                if (project->isEmpty("QMAKE_BUNDLE_EXTENSION"))
                    project->values("QMAKE_BUNDLE_EXTENSION").append(".framework");
                if (!bundle.endsWith(project->first("QMAKE_BUNDLE_EXTENSION")))
                    bundle += project->first("QMAKE_BUNDLE_EXTENSION");
            }
        }
        if(!bundle.isEmpty()) {
            project->values("QMAKE_BUNDLE") = ProStringList(bundle);
        } else {
            project->values("QMAKE_BUNDLE").clear();
            project->values("QMAKE_BUNDLE_LOCATION").clear();
        }
    } else { //no bundling here
        project->values("QMAKE_BUNDLE").clear();
        project->values("QMAKE_BUNDLE_LOCATION").clear();
    }

    init2();
    ProString target = project->first("TARGET");
    int slsh = target.lastIndexOf(Option::dir_sep);
    if (slsh != -1)
        target.chopFront(slsh + 1);
    project->values("LIB_TARGET").prepend(target);
}